

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined8 *puVar1;
  undefined1 (*pauVar2) [12];
  long *plVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  float *pfVar26;
  float *pfVar27;
  float *pfVar28;
  float *pfVar29;
  float *pfVar30;
  float *pfVar31;
  float *pfVar32;
  float *pfVar33;
  float *pfVar34;
  float *pfVar35;
  float *pfVar36;
  float *pfVar37;
  float *pfVar38;
  float *pfVar39;
  float *pfVar40;
  float *pfVar41;
  float *pfVar42;
  float *pfVar43;
  float *pfVar44;
  float *pfVar45;
  float *pfVar46;
  float *pfVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  size_t sVar50;
  size_t sVar51;
  void *pvVar52;
  int *piVar53;
  Layer *pLVar54;
  undefined4 *puVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  undefined8 uVar257;
  undefined8 uVar258;
  undefined8 uVar259;
  undefined8 uVar260;
  undefined8 uVar261;
  undefined8 uVar262;
  undefined8 uVar263;
  undefined8 uVar264;
  undefined8 uVar265;
  undefined8 uVar266;
  undefined8 uVar267;
  undefined8 uVar268;
  undefined8 uVar269;
  undefined8 uVar270;
  undefined1 auVar271 [12];
  undefined1 auVar272 [12];
  undefined8 uVar273;
  undefined8 uVar274;
  Allocator *pAVar275;
  int iVar276;
  int iVar277;
  int iVar278;
  int iVar279;
  byte bVar280;
  int iVar281;
  uint uVar282;
  int iVar283;
  void *pvVar284;
  ulong uVar285;
  uint uVar286;
  int iVar287;
  ulong uVar288;
  int iVar289;
  int iVar290;
  float *pfVar291;
  ulong uVar292;
  float *pfVar293;
  long lVar294;
  void *pvVar295;
  void *pvVar296;
  int _w;
  uint uVar297;
  long lVar298;
  ulong uVar299;
  long lVar300;
  uint uVar301;
  undefined1 (*pauVar302) [16];
  void *pvVar303;
  int _h;
  int iVar304;
  long lVar305;
  pointer piVar306;
  void *pvVar307;
  float *pfVar308;
  long lVar309;
  pointer piVar310;
  void *pvVar311;
  int j;
  int iVar312;
  float *pfVar313;
  ulong uVar314;
  float *pfVar315;
  uint uVar316;
  float *pfVar317;
  pointer piVar318;
  pointer piVar319;
  bool bVar320;
  undefined8 uVar321;
  undefined8 uVar324;
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  float fVar330;
  float fVar334;
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined4 uVar335;
  undefined4 uVar336;
  undefined4 uVar337;
  undefined4 uVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  v4sf one;
  float fVar343;
  float fVar344;
  float fVar355;
  float fVar358;
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  float fVar345;
  float fVar356;
  float fVar359;
  undefined1 auVar351 [16];
  float fVar346;
  float fVar357;
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  float fVar360;
  float fVar361;
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar365;
  float fVar366;
  float fVar367;
  undefined1 auVar368 [16];
  undefined8 local_2d8;
  float fStack_2d0;
  float fStack_2cc;
  undefined8 local_2c8;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  Mat local_238;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  Option opt_p;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m_1;
  Mat m;
  Option opt_g;
  
  if ((opt->use_int8_inference == true) && ((this->super_ConvolutionDepthWise).int8_scale_term != 0)
     ) {
    iVar281 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar281;
  }
  uVar297 = bottom_blob->c;
  uVar299 = (ulong)uVar297;
  uVar314 = bottom_blob->elemsize;
  iVar281 = bottom_blob->elempack;
  iVar304 = (this->super_ConvolutionDepthWise).kernel_w;
  iVar312 = (this->super_ConvolutionDepthWise).kernel_h;
  iVar287 = (this->super_ConvolutionDepthWise).dilation_w;
  iVar289 = (this->super_ConvolutionDepthWise).dilation_h;
  local_238.cstep = 0;
  local_238.data = (pointer)0x0;
  local_238.refcount._0_4_ = 0;
  local_238.refcount._4_4_ = 0;
  local_238.elemsize._0_4_ = 0;
  local_238.elemsize._4_4_ = 0;
  local_238.elempack = 0;
  local_238.allocator = (Allocator *)0x0;
  local_238.dims = 0;
  local_238.w = 0;
  local_238.h = 0;
  local_238.d = 0;
  local_238.c = 0;
  ConvolutionDepthWise::make_padding(&this->super_ConvolutionDepthWise,bottom_blob,&local_238,opt);
  iVar276 = local_238.w;
  iVar290 = -100;
  if (((pointer)local_238.data == (pointer)0x0) || ((long)local_238.c * local_238.cstep == 0))
  goto LAB_003b1b2b;
  iVar304 = (~((iVar304 + -1) * iVar287) + local_238.w) /
            (this->super_ConvolutionDepthWise).stride_w;
  iVar312 = (~((iVar312 + -1) * iVar289) + local_238.h) /
            (this->super_ConvolutionDepthWise).stride_h;
  _w = iVar304 + 1;
  _h = iVar312 + 1;
  uVar316 = (this->super_ConvolutionDepthWise).num_output;
  bVar280 = (uVar316 & 3) == 0 & opt->use_packing_layout;
  uVar301 = (uint)bVar280 + (uint)bVar280 * 2 + 1;
  uVar314 = uVar314 / (ulong)(long)iVar281 << bVar280 * '\x02';
  Mat::create(top_blob,_w,_h,(int)uVar316 / (int)uVar301,uVar314,uVar301,opt->blob_allocator);
  sVar51 = local_238.cstep;
  iVar279 = local_238.c;
  iVar278 = local_238.d;
  iVar277 = local_238.h;
  iVar283 = local_238.w;
  iVar289 = local_238.dims;
  pAVar275 = local_238.allocator;
  iVar287 = local_238.elempack;
  pvVar311 = top_blob->data;
  if ((pvVar311 == (void *)0x0) || (sVar50 = top_blob->cstep, (long)top_blob->c * sVar50 == 0))
  goto LAB_003b1b2b;
  uVar282 = iVar281 * uVar297;
  uVar316 = (this->super_ConvolutionDepthWise).num_output;
  uVar286 = (this->super_ConvolutionDepthWise).group;
  if (uVar286 != uVar316 || (uVar282 ^ uVar286) != 0) {
LAB_003b0530:
    uVar299 = (long)(int)uVar282 / (long)(int)uVar286;
    uVar288 = (long)(int)uVar316 / (long)(int)uVar286;
    if (opt->use_packing_layout == true) {
      uVar316 = (uint)((uVar288 & 3) == 0) * 3 + 1;
      uVar297 = (uint)((uVar299 & 3) == 0) * 3 + 1;
    }
    else {
      uVar316 = 1;
      uVar297 = uVar316;
    }
    _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
    _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_238.data;
    _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize);
    if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish != (int *)0x0) {
      LOCK();
      *_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = *_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      UNLOCK();
    }
    local_2c8 = uVar299 & 0xffffffff;
    local_2d8 = uVar288 & 0xffffffff;
    uVar292 = uVar299;
    uVar285 = uVar288;
    if ((int)uVar297 < iVar281) {
      opt_p.lightmode = opt->lightmode;
      opt_p.use_shader_pack8 = opt->use_shader_pack8;
      opt_p.use_subgroup_ops = opt->use_subgroup_ops;
      opt_p.use_reserved_0 = opt->use_reserved_0;
      opt_p.num_threads = opt->num_threads;
      opt_p.workspace_allocator = opt->workspace_allocator;
      opt_p.openmp_blocktime = opt->openmp_blocktime;
      opt_p.use_winograd_convolution = opt->use_winograd_convolution;
      opt_p.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_p.use_int8_inference = opt->use_int8_inference;
      opt_p.use_vulkan_compute = opt->use_vulkan_compute;
      opt_p.use_bf16_storage = opt->use_bf16_storage;
      opt_p.use_fp16_packed = opt->use_fp16_packed;
      opt_p.use_fp16_storage = opt->use_fp16_storage;
      opt_p.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_p.use_int8_packed = opt->use_int8_packed;
      opt_p.use_int8_storage = opt->use_int8_storage;
      opt_p.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_p.use_packing_layout = opt->use_packing_layout;
      opt_p.vulkan_device_index = opt->vulkan_device_index;
      opt_p.use_reserved_1 = opt->use_reserved_1;
      opt_p.use_image_storage = opt->use_image_storage;
      opt_p.use_tensor_storage = opt->use_tensor_storage;
      opt_p.use_reserved_2 = opt->use_reserved_2;
      opt_p.flush_denormals = opt->flush_denormals;
      opt_p.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_p.use_shader_local_memory = opt->use_shader_local_memory;
      opt_p.use_cooperative_matrix = opt->use_cooperative_matrix;
      opt_p.use_winograd23_convolution = opt->use_winograd23_convolution;
      opt_p.use_winograd43_convolution = opt->use_winograd43_convolution;
      opt_p.use_winograd63_convolution = opt->use_winograd63_convolution;
      opt_p.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
      opt_p.use_fp16_uniform = opt->use_fp16_uniform;
      opt_p.use_int8_uniform = opt->use_int8_uniform;
      opt_p.use_reserved_9 = opt->use_reserved_9;
      opt_p.use_reserved_10 = opt->use_reserved_10;
      opt_p.use_reserved_11 = opt->use_reserved_11;
      opt_p.blob_allocator = opt->workspace_allocator;
      convert_packing(&local_238,(Mat *)&_space_ofs,uVar297,&opt_p);
      if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        uVar292 = uVar299 & 0xffffffff;
        uVar285 = uVar288 & 0xffffffff;
        if ((long)iVar279 * sVar51 != 0) goto LAB_003b068d;
      }
      iVar290 = -100;
    }
    else {
LAB_003b068d:
      opt_p._0_8_ = top_blob->data;
      opt_p.blob_allocator = (Allocator *)top_blob->refcount;
      opt_p.workspace_allocator = (Allocator *)top_blob->elemsize;
      opt_p.openmp_blocktime = top_blob->elempack;
      opt_p._32_8_ = top_blob->allocator;
      opt_p._40_8_ = *(undefined8 *)&top_blob->dims;
      opt_p._48_8_ = *(undefined8 *)&top_blob->h;
      opt_p._56_4_ = top_blob->c;
      sVar50 = top_blob->cstep;
      if (opt_p.blob_allocator != (Allocator *)0x0) {
        LOCK();
        *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
             *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + 1;
        UNLOCK();
      }
      if (uVar316 < uVar301) {
        Mat::create((Mat *)&opt_p,_w,_h,(this->super_ConvolutionDepthWise).num_output / (int)uVar316
                    ,(ulong)uVar316 * (uVar314 >> bVar280 * '\x02'),uVar316,opt->workspace_allocator
                   );
        iVar290 = -100;
        if (opt_p._0_8_ != 0) {
          uVar292 = uVar299 & 0xffffffff;
          uVar285 = uVar288 & 0xffffffff;
          if ((long)(int)opt_p._56_4_ * sVar50 != 0) goto LAB_003b0775;
        }
      }
      else {
LAB_003b0775:
        iVar281 = 0;
        iVar304 = 0;
        lVar300 = 0;
        do {
          uVar324 = opt_p._48_8_;
          uVar321 = opt_p._40_8_;
          if ((this->super_ConvolutionDepthWise).group <= lVar300) {
            if (uVar316 < uVar301) {
              convert_packing((Mat *)&opt_p,top_blob,uVar301,opt);
              iVar290 = -100;
              if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
              break;
            }
            else if ((Mat *)&opt_p != top_blob) {
              if (opt_p.blob_allocator != (Allocator *)0x0) {
                LOCK();
                *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
                     *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + 1;
                UNLOCK();
              }
              piVar53 = top_blob->refcount;
              if (piVar53 != (int *)0x0) {
                LOCK();
                *piVar53 = *piVar53 + -1;
                UNLOCK();
                if (*piVar53 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    free(top_blob->data);
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->data = (void *)opt_p._0_8_;
              top_blob->refcount = (int *)opt_p.blob_allocator;
              top_blob->elemsize = (size_t)opt_p.workspace_allocator;
              top_blob->elempack = opt_p.openmp_blocktime;
              top_blob->allocator = (Allocator *)opt_p._32_8_;
              *(undefined8 *)&top_blob->dims = opt_p._40_8_;
              *(undefined8 *)&top_blob->h = opt_p._48_8_;
              top_blob->c = opt_p._56_4_;
              top_blob->cstep = sVar50;
            }
            iVar290 = 0;
            break;
          }
          m.c = (int)uVar292 / (int)uVar297;
          m.data = (void *)((long)(iVar281 / (int)uVar297) * sVar51 *
                            (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage +
                           (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start);
          m.refcount = (int *)0x0;
          m.elemsize = (size_t)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
          m.elempack = iVar287;
          m.allocator = pAVar275;
          m.w = iVar283;
          m.h = iVar277;
          m.d = iVar278;
          m.cstep = ((long)iVar278 *
                     (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage * (long)iVar277 * (long)iVar283
                     + 0xfU & 0xfffffffffffffff0) /
                    (ulong)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
          m.dims = iVar289;
          m_1.c = (int)uVar285 / (int)uVar316;
          m_1.data = (void *)((long)(iVar304 / (int)uVar316) * sVar50 *
                              (long)opt_p.workspace_allocator + opt_p._0_8_);
          m_1.refcount = (int *)0x0;
          m_1.elemsize = (size_t)opt_p.workspace_allocator;
          m_1.elempack = opt_p.openmp_blocktime;
          m_1.allocator = (Allocator *)opt_p._32_8_;
          m_1.w._0_1_ = opt_p.use_reserved_1;
          m_1.w._1_1_ = opt_p.use_image_storage;
          m_1.w._2_1_ = opt_p.use_tensor_storage;
          m_1.w._3_1_ = opt_p.use_reserved_2;
          m_1.h = opt_p.flush_denormals;
          m_1.d._0_1_ = opt_p.use_local_pool_allocator;
          m_1.d._1_1_ = opt_p.use_shader_local_memory;
          m_1.d._2_1_ = opt_p.use_cooperative_matrix;
          m_1.d._3_1_ = opt_p.use_winograd23_convolution;
          m_1.cstep = ((long)(int)opt_p._52_4_ * (long)opt_p.workspace_allocator *
                       (long)opt_p.flush_denormals * (long)(int)opt_p._44_4_ + 0xfU &
                      0xfffffffffffffff0) / (ulong)opt_p.workspace_allocator;
          opt_p.vulkan_device_index = (int)uVar321;
          m_1.dims = opt_p.vulkan_device_index;
          pLVar54 = (this->group_ops).
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar300];
          opt_g.lightmode = opt->lightmode;
          opt_g.use_shader_pack8 = opt->use_shader_pack8;
          opt_g.use_subgroup_ops = opt->use_subgroup_ops;
          opt_g.use_reserved_0 = opt->use_reserved_0;
          opt_g.num_threads = opt->num_threads;
          opt_g.workspace_allocator = opt->workspace_allocator;
          opt_g.openmp_blocktime = opt->openmp_blocktime;
          opt_g.use_winograd_convolution = opt->use_winograd_convolution;
          opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
          opt_g.use_int8_inference = opt->use_int8_inference;
          opt_g.use_vulkan_compute = opt->use_vulkan_compute;
          opt_g.use_bf16_storage = opt->use_bf16_storage;
          opt_g.use_fp16_packed = opt->use_fp16_packed;
          opt_g.use_fp16_storage = opt->use_fp16_storage;
          opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
          opt_g.use_int8_packed = opt->use_int8_packed;
          opt_g.use_int8_storage = opt->use_int8_storage;
          opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
          opt_g.use_packing_layout = opt->use_packing_layout;
          opt_g.vulkan_device_index = opt->vulkan_device_index;
          opt_g.use_reserved_1 = opt->use_reserved_1;
          opt_g.use_image_storage = opt->use_image_storage;
          opt_g.use_tensor_storage = opt->use_tensor_storage;
          opt_g.use_reserved_2 = opt->use_reserved_2;
          opt_g.flush_denormals = opt->flush_denormals;
          opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
          opt_g.use_shader_local_memory = opt->use_shader_local_memory;
          opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
          opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
          opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
          opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
          opt_g.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
          opt_g.use_fp16_uniform = opt->use_fp16_uniform;
          opt_g.use_int8_uniform = opt->use_int8_uniform;
          opt_g.use_reserved_9 = opt->use_reserved_9;
          opt_g.use_reserved_10 = opt->use_reserved_10;
          opt_g.use_reserved_11 = opt->use_reserved_11;
          opt_g.blob_allocator = (Allocator *)opt_p._32_8_;
          opt_p._40_8_ = uVar321;
          opt_p._48_8_ = uVar324;
          iVar290 = (*pLVar54->_vptr_Layer[7])(pLVar54,&m,&m_1,&opt_g);
          if (m_1.refcount != (int *)0x0) {
            LOCK();
            *m_1.refcount = *m_1.refcount + -1;
            UNLOCK();
            if (*m_1.refcount == 0) {
              if (m_1.allocator == (Allocator *)0x0) {
                free(m_1.data);
              }
              else {
                (*(m_1.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (m.refcount != (int *)0x0) {
            LOCK();
            *m.refcount = *m.refcount + -1;
            UNLOCK();
            if (*m.refcount == 0) {
              if (m.allocator == (Allocator *)0x0) {
                free(m.data);
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          lVar300 = lVar300 + 1;
          iVar304 = iVar304 + (int)uVar288;
          iVar281 = iVar281 + (int)uVar299;
          uVar292 = local_2c8;
          uVar285 = local_2d8;
        } while (iVar290 == 0);
      }
      if (opt_p.blob_allocator != (Allocator *)0x0) {
        LOCK();
        *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
             *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + -1;
        UNLOCK();
        if (*(int *)&(opt_p.blob_allocator)->_vptr_Allocator == 0) {
          if (opt_p._32_8_ == 0) {
            free((void *)opt_p._0_8_);
          }
          else {
            (**(code **)(*(long *)opt_p._32_8_ + 0x18))();
          }
        }
      }
    }
    if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish != (pointer)0x0) {
      LOCK();
      *_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = *_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
      UNLOCK();
      if (*_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish == 0) {
        if (pAVar275 == (Allocator *)0x0) {
          free(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
        else {
          (*pAVar275->_vptr_Allocator[3])();
        }
      }
    }
    goto LAB_003b1b2b;
  }
  if (iVar281 == 1) {
    auVar322._0_4_ = -(uint)((this->super_ConvolutionDepthWise).kernel_w == 3);
    auVar322._4_4_ = -(uint)((this->super_ConvolutionDepthWise).kernel_h == 3);
    auVar322._8_4_ = -(uint)((this->super_ConvolutionDepthWise).dilation_w == 1);
    auVar322._12_4_ = -(uint)((this->super_ConvolutionDepthWise).dilation_h == 1);
    uVar297 = movmskps(uVar282 ^ uVar286,auVar322);
    iVar304 = (this->super_ConvolutionDepthWise).stride_w;
    iVar312 = (this->super_ConvolutionDepthWise).stride_h;
    if (iVar312 == 1 && (iVar304 == 1 && (uVar297 ^ 0xf) == 0)) {
      lVar294 = (long)local_238.w;
      iVar281 = top_blob->w;
      iVar304 = top_blob->h;
      pvVar295 = (this->super_ConvolutionDepthWise).bias_data.data;
      sVar51 = top_blob->elemsize;
      pvVar52 = (this->weight_data_tm).data;
      lVar300 = (long)iVar281;
      local_1e8 = CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize) *
                  local_238.cstep;
      local_1d8 = lVar294 * 2;
      uVar314 = 0;
      uVar297 = local_238.c;
      if (local_238.c < 1) {
        uVar297 = 0;
      }
      lVar298 = (long)(local_238.w + 2) * 4;
      for (; uVar314 != uVar297; uVar314 = uVar314 + 1) {
        if (pvVar295 == (void *)0x0) {
          fVar339 = 0.0;
        }
        else {
          fVar339 = *(float *)((long)pvVar295 + uVar314 * 4);
        }
        pvVar296 = (void *)(sVar50 * sVar51 * uVar314 + (long)pvVar311);
        lVar305 = uVar314 * 0x24;
        piVar318 = (pointer)(local_1e8 * uVar314 + (long)local_238.data);
        piVar310 = piVar318 + lVar294;
        piVar306 = piVar318 + lVar294 * 2;
        piVar319 = piVar318 + lVar294 * 3;
        pvVar284 = pvVar296;
        for (uVar316 = 0; (int)(uVar316 | 1) < iVar304; uVar316 = uVar316 + 2) {
          lVar309 = 0;
          for (iVar312 = iVar281; 0 < iVar312; iVar312 = iVar312 + -1) {
            uVar321 = *(undefined8 *)((long)piVar318 + lVar309 + 4);
            uVar324 = *(undefined8 *)((long)piVar310 + lVar309 + 4);
            fVar359 = (float)uVar324;
            fVar340 = (float)((ulong)uVar324 >> 0x20);
            fVar356 = (float)*(undefined8 *)((long)piVar306 + lVar309);
            fVar358 = (float)((ulong)*(undefined8 *)((long)piVar306 + lVar309) >> 0x20);
            pfVar313 = (float *)((long)pvVar52 + lVar305);
            fVar346 = *pfVar313;
            fVar334 = pfVar313[1];
            fVar357 = pfVar313[2];
            fVar364 = pfVar313[3];
            pfVar313 = (float *)((long)pvVar52 + lVar305 + 0x10);
            fVar365 = *pfVar313;
            fVar366 = pfVar313[1];
            fVar367 = pfVar313[2];
            fVar345 = pfVar313[3];
            fVar341 = *(float *)((long)piVar310 + lVar309);
            fVar342 = *(float *)((long)piVar306 + lVar309 + 8);
            fVar343 = *(float *)((long)pvVar52 + lVar305 + 0x20);
            uVar324 = *(undefined8 *)((long)piVar319 + lVar309);
            fVar330 = *(float *)((long)piVar319 + lVar309 + 8);
            *(float *)((long)pvVar284 + lVar309) =
                 fVar343 * fVar342 + fVar339 +
                 fVar358 * fVar345 + fVar341 * fVar364 +
                 fVar340 * fVar366 + (float)uVar321 * fVar334 +
                 fVar356 * fVar367 + (float)((ulong)uVar321 >> 0x20) * fVar357 +
                 fVar359 * fVar365 + *(float *)((long)piVar318 + lVar309) * fVar346;
            *(float *)((long)pvVar296 + lVar309 + lVar300 * 4) =
                 fVar343 * fVar330 + fVar339 +
                 (float)((ulong)uVar324 >> 0x20) * fVar345 + fVar364 * fVar356 +
                 fVar342 * fVar366 + fVar334 * fVar359 +
                 (float)uVar324 * fVar367 + fVar357 * fVar340 +
                 fVar358 * fVar365 + fVar341 * fVar346;
            lVar309 = lVar309 + 4;
          }
          piVar318 = (pointer)((long)piVar318 + lVar309 + lVar298);
          piVar310 = (pointer)((long)piVar310 + lVar309 + lVar298);
          piVar306 = (pointer)((long)piVar306 + lVar309 + lVar298);
          piVar319 = (pointer)((long)piVar319 + lVar309 + lVar298);
          pvVar284 = (void *)((long)pvVar284 + lVar309 + lVar300 * 4);
          pvVar296 = (void *)((long)pvVar296 + lVar309 + lVar300 * 4);
        }
        for (; (int)uVar316 < iVar304; uVar316 = uVar316 + 1) {
          lVar309 = 0;
          for (iVar312 = iVar281; 0 < iVar312; iVar312 = iVar312 + -1) {
            uVar321 = *(undefined8 *)((long)piVar318 + lVar309 + 4);
            pfVar313 = (float *)((long)pvVar52 + lVar305);
            pfVar308 = (float *)((long)pvVar52 + lVar305 + 0x10);
            uVar324 = *(undefined8 *)((long)piVar310 + lVar309 + 4);
            *(float *)((long)pvVar284 + lVar309) =
                 *(float *)((long)pvVar52 + lVar305 + 0x20) *
                 *(float *)((long)piVar306 + lVar309 + 8) + fVar339 +
                 (float)((ulong)*(undefined8 *)((long)piVar306 + lVar309) >> 0x20) * pfVar308[3] +
                 *(float *)((long)piVar310 + lVar309) * pfVar313[3] +
                 (float)((ulong)uVar324 >> 0x20) * pfVar308[1] + (float)uVar321 * pfVar313[1] +
                 (float)*(undefined8 *)((long)piVar306 + lVar309) * pfVar308[2] +
                 (float)((ulong)uVar321 >> 0x20) * pfVar313[2] +
                 (float)uVar324 * *pfVar308 + *(float *)((long)piVar318 + lVar309) * *pfVar313;
            lVar309 = lVar309 + 4;
          }
          piVar318 = (pointer)((long)piVar318 + lVar309 + 8);
          piVar310 = (pointer)((long)piVar310 + lVar309 + 8);
          piVar306 = (pointer)((long)piVar306 + lVar309 + 8);
          pvVar284 = (void *)((long)pvVar284 + lVar309);
        }
      }
    }
    else {
      if ((iVar312 != 2 || iVar304 != 2) || (char)(uVar297 ^ 0xf) != '\0') goto LAB_003b0530;
      iVar281 = top_blob->w;
      pvVar295 = (this->super_ConvolutionDepthWise).bias_data.data;
      pvVar52 = (this->weight_data_tm).data;
      sVar51 = top_blob->elemsize;
      uVar314 = 0;
      iVar304 = top_blob->h;
      if (top_blob->h < 1) {
        iVar304 = 0;
      }
      uVar299 = (ulong)(uint)local_238.c;
      if (local_238.c < 1) {
        uVar299 = uVar314;
      }
      lVar300 = (long)((local_238.w - iVar281) * 2) * 4;
      for (; uVar314 != uVar299; uVar314 = uVar314 + 1) {
        if (pvVar295 == (void *)0x0) {
          fVar339 = 0.0;
        }
        else {
          fVar339 = *(float *)((long)pvVar295 + uVar314 * 4);
        }
        pfVar313 = (float *)(sVar50 * sVar51 * uVar314 + (long)pvVar311);
        lVar294 = uVar314 * 0x24;
        piVar306 = (pointer)(CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize) *
                             local_238.cstep * uVar314 + (long)local_238.data);
        piVar310 = piVar306 + local_238.w;
        piVar319 = piVar306 + (long)local_238.w * 2;
        for (iVar312 = 0; iVar312 != iVar304; iVar312 = iVar312 + 1) {
          lVar298 = 0;
          for (iVar287 = iVar281; 0 < iVar287; iVar287 = iVar287 + -1) {
            uVar321 = *(undefined8 *)((long)piVar306 + lVar298 + 4);
            pfVar308 = (float *)((long)pvVar52 + lVar294);
            pfVar315 = (float *)((long)pvVar52 + lVar294 + 0x10);
            uVar324 = *(undefined8 *)((long)piVar310 + lVar298 + 4);
            *pfVar313 = (float)((ulong)*(undefined8 *)((long)piVar319 + lVar298) >> 0x20) *
                        pfVar315[3] + *(float *)((long)piVar310 + lVar298) * pfVar308[3] +
                        (float)((ulong)uVar324 >> 0x20) * pfVar315[1] + (float)uVar321 * pfVar308[1]
                        + (float)*(undefined8 *)((long)piVar319 + lVar298) * pfVar315[2] +
                          (float)((ulong)uVar321 >> 0x20) * pfVar308[2] +
                          (float)uVar324 * *pfVar315 +
                          *(float *)((long)piVar306 + lVar298) * *pfVar308 +
                        *(float *)((long)pvVar52 + lVar294 + 0x20) *
                        *(float *)((long)piVar319 + lVar298 + 8) + fVar339;
            pfVar313 = pfVar313 + 1;
            lVar298 = lVar298 + 8;
          }
          piVar306 = (pointer)((long)piVar306 + lVar298 + lVar300);
          piVar310 = (pointer)((long)piVar310 + lVar298 + lVar300);
          piVar319 = (pointer)((long)piVar319 + lVar298 + lVar300);
        }
      }
    }
    goto LAB_003b1488;
  }
  if (iVar281 != 4) goto LAB_003b0530;
  iVar289 = (this->super_ConvolutionDepthWise).kernel_w;
  iVar290 = (this->super_ConvolutionDepthWise).kernel_h;
  auVar325._0_4_ = -(uint)(iVar289 == 3);
  auVar325._4_4_ = -(uint)(iVar290 == 3);
  auVar325._8_4_ = -(uint)((this->super_ConvolutionDepthWise).dilation_w == 1);
  auVar325._12_4_ = -(uint)((this->super_ConvolutionDepthWise).dilation_h == 1);
  iVar283 = movmskps(uVar282,auVar325);
  iVar281 = (this->super_ConvolutionDepthWise).stride_w;
  iVar287 = (this->super_ConvolutionDepthWise).stride_h;
  if (iVar287 == 1 && (iVar281 == 1 && iVar283 == 0xf)) {
    iVar281 = top_blob->w;
    pvVar311 = (this->super_ConvolutionDepthWise).bias_data.data;
    uVar299 = 0;
    uVar314 = (ulong)(uint)top_blob->h;
    if (top_blob->h < 1) {
      uVar314 = uVar299;
    }
    uVar297 = local_238.c;
    if (local_238.c < 1) {
      uVar297 = 0;
    }
    for (; uVar299 != uVar297; uVar299 = uVar299 + 1) {
      if (pvVar311 == (void *)0x0) {
        uVar321 = 0;
        uVar324 = 0;
      }
      else {
        puVar1 = (undefined8 *)((long)pvVar311 + uVar299 * 0x10);
        uVar321 = *puVar1;
        uVar324 = puVar1[1];
      }
      pauVar302 = (undefined1 (*) [16])
                  (top_blob->cstep * uVar299 * top_blob->elemsize + (long)top_blob->data);
      pvVar295 = (this->weight_data_tm).data;
      lVar298 = (long)(this->weight_data_tm).w * uVar299 * (this->weight_data_tm).elemsize;
      pfVar315 = (float *)(local_238.cstep * uVar299 *
                           CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize) +
                          (long)local_238.data);
      lVar305 = (long)local_238.w *
                CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize);
      uVar257 = *(undefined8 *)((long)pvVar295 + lVar298);
      uVar258 = ((undefined8 *)((long)pvVar295 + lVar298))[1];
      puVar1 = (undefined8 *)((long)pvVar295 + lVar298 + 0x10);
      uVar259 = *puVar1;
      uVar260 = puVar1[1];
      pauVar2 = (undefined1 (*) [12])((long)pvVar295 + lVar298 + 0x20);
      auVar272 = *pauVar2;
      auVar271 = *pauVar2;
      local_248 = (float)*(undefined8 *)*pauVar2;
      fStack_244 = (float)((ulong)*(undefined8 *)*pauVar2 >> 0x20);
      fStack_240 = (float)*(undefined8 *)(*pauVar2 + 8);
      fStack_23c = (float)((ulong)*(undefined8 *)(*pauVar2 + 8) >> 0x20);
      puVar1 = (undefined8 *)((long)pvVar295 + lVar298 + 0x30);
      uVar261 = *puVar1;
      uVar262 = puVar1[1];
      puVar1 = (undefined8 *)((long)pvVar295 + lVar298 + 0x40);
      uVar263 = *puVar1;
      uVar264 = puVar1[1];
      puVar1 = (undefined8 *)((long)pvVar295 + lVar298 + 0x50);
      uVar265 = *puVar1;
      uVar266 = puVar1[1];
      puVar1 = (undefined8 *)((long)pvVar295 + lVar298 + 0x60);
      uVar267 = *puVar1;
      uVar268 = puVar1[1];
      plVar3 = (long *)((long)pvVar295 + lVar298 + 0x70);
      lVar300 = *plVar3;
      lVar294 = plVar3[1];
      pfVar313 = (float *)((long)pvVar295 + lVar298 + 0x80);
      fVar339 = *pfVar313;
      fVar341 = pfVar313[1];
      uVar274 = *(undefined8 *)pfVar313;
      uVar273 = *(undefined8 *)pfVar313;
      fVar342 = pfVar313[2];
      fVar343 = pfVar313[3];
      pfVar313 = (float *)(lVar305 + (long)pfVar315);
      pfVar308 = (float *)(lVar305 * 2 + (long)pfVar315);
      for (iVar304 = 0; iVar304 != (int)uVar314; iVar304 = iVar304 + 1) {
        pfVar317 = pfVar315 + 8;
        pfVar293 = pfVar313 + 8;
        pfVar291 = pfVar308 + 8;
        lVar298 = 0;
        iVar312 = 0;
        while( true ) {
          local_2d8._0_4_ = (float)uVar257;
          local_2d8._4_4_ = (float)((ulong)uVar257 >> 0x20);
          fStack_2d0 = (float)uVar258;
          fStack_2cc = (float)((ulong)uVar258 >> 0x20);
          local_2a8 = (float)uVar259;
          fStack_2a4 = (float)((ulong)uVar259 >> 0x20);
          fStack_2a0 = (float)uVar260;
          fStack_29c = (float)((ulong)uVar260 >> 0x20);
          local_278 = (float)uVar261;
          fStack_274 = (float)((ulong)uVar261 >> 0x20);
          fStack_270 = (float)uVar262;
          fStack_26c = (float)((ulong)uVar262 >> 0x20);
          local_2b8 = (float)uVar263;
          fStack_2b4 = (float)((ulong)uVar263 >> 0x20);
          fStack_2b0 = (float)uVar264;
          fStack_2ac = (float)((ulong)uVar264 >> 0x20);
          local_268 = (float)uVar265;
          fStack_264 = (float)((ulong)uVar265 >> 0x20);
          fStack_260 = (float)uVar266;
          fStack_25c = (float)((ulong)uVar266 >> 0x20);
          local_1e8._0_4_ = (float)lVar300;
          local_1e8._4_4_ = (float)((ulong)lVar300 >> 0x20);
          uStack_1e0._0_4_ = (float)lVar294;
          uStack_1e0._4_4_ = (float)((ulong)lVar294 >> 0x20);
          local_288 = (float)uVar267;
          fStack_284 = (float)((ulong)uVar267 >> 0x20);
          fStack_280 = (float)uVar268;
          fStack_27c = (float)((ulong)uVar268 >> 0x20);
          local_2c8._0_4_ = (float)uVar321;
          local_2c8._4_4_ = (float)((ulong)uVar321 >> 0x20);
          fStack_2c0 = (float)uVar324;
          fStack_2bc = (float)((ulong)uVar324 >> 0x20);
          if (iVar281 <= iVar312 + 7) break;
          pfVar27 = (float *)((long)pfVar315 + lVar298);
          fVar330 = pfVar27[1];
          fVar346 = pfVar27[2];
          fVar334 = pfVar27[3];
          pfVar4 = (float *)((long)pfVar315 + lVar298 + 0x10);
          fVar357 = *pfVar4;
          fVar364 = pfVar4[1];
          fVar365 = pfVar4[2];
          fVar366 = pfVar4[3];
          pfVar4 = (float *)((long)pfVar315 + lVar298 + 0x20);
          fVar367 = *pfVar4;
          fVar345 = pfVar4[1];
          fVar356 = pfVar4[2];
          fVar358 = pfVar4[3];
          pfVar4 = (float *)((long)pfVar315 + lVar298 + 0x30);
          fVar359 = *pfVar4;
          fVar340 = pfVar4[1];
          fVar61 = pfVar4[2];
          fVar62 = pfVar4[3];
          pfVar28 = (float *)((long)pfVar313 + lVar298);
          fVar63 = pfVar28[1];
          fVar64 = pfVar28[2];
          fVar65 = pfVar28[3];
          pfVar4 = (float *)((long)pfVar313 + lVar298 + 0x10);
          fVar66 = *pfVar4;
          fVar67 = pfVar4[1];
          fVar68 = pfVar4[2];
          fVar69 = pfVar4[3];
          pfVar4 = (float *)((long)pfVar313 + lVar298 + 0x20);
          fVar70 = *pfVar4;
          fVar71 = pfVar4[1];
          fVar72 = pfVar4[2];
          fVar73 = pfVar4[3];
          puVar1 = (undefined8 *)((long)pfVar313 + lVar298 + 0x30);
          uVar269 = *puVar1;
          uVar270 = puVar1[1];
          pfVar4 = (float *)((long)pfVar308 + lVar298);
          fVar74 = pfVar4[1];
          fVar75 = pfVar4[2];
          fVar76 = pfVar4[3];
          pfVar5 = (float *)((long)pfVar308 + lVar298 + 0x10);
          fVar77 = *pfVar5;
          fVar78 = pfVar5[1];
          fVar79 = pfVar5[2];
          fVar80 = pfVar5[3];
          pfVar5 = (float *)((long)pfVar308 + lVar298 + 0x20);
          fVar81 = *pfVar5;
          fVar82 = pfVar5[1];
          fVar83 = pfVar5[2];
          fVar84 = pfVar5[3];
          pfVar5 = (float *)((long)pfVar308 + lVar298 + 0x30);
          fVar85 = *pfVar5;
          fVar86 = pfVar5[1];
          fVar87 = pfVar5[2];
          fVar88 = pfVar5[3];
          pfVar5 = (float *)((long)*pauVar302 + lVar298);
          *pfVar5 = fVar81 * fVar339 + fVar77 * (float)local_1e8 + *pfVar4 * local_288 +
                    fVar70 * local_268 + fVar66 * local_2b8 + *pfVar28 * local_278 +
                    fVar367 * local_248 + fVar357 * local_2a8 +
                    *pfVar27 * (float)local_2d8 + (float)local_2c8;
          pfVar5[1] = fVar82 * fVar341 + fVar78 * local_1e8._4_4_ + fVar74 * fStack_284 +
                      fVar71 * fStack_264 + fVar67 * fStack_2b4 + fVar63 * fStack_274 +
                      fVar345 * fStack_244 + fVar364 * fStack_2a4 +
                      fVar330 * local_2d8._4_4_ + local_2c8._4_4_;
          pfVar5[2] = fVar83 * fVar342 + fVar79 * (float)uStack_1e0 + fVar75 * fStack_280 +
                      fVar72 * fStack_260 + fVar68 * fStack_2b0 + fVar64 * fStack_270 +
                      fVar356 * fStack_240 + fVar365 * fStack_2a0 +
                      fVar346 * fStack_2d0 + fStack_2c0;
          pfVar5[3] = fVar84 * fVar343 + fVar80 * uStack_1e0._4_4_ + fVar76 * fStack_27c +
                      fVar73 * fStack_25c + fVar69 * fStack_2ac + fVar65 * fStack_26c +
                      fVar358 * fStack_23c + fVar366 * fStack_29c +
                      fVar334 * fStack_2cc + fStack_2bc;
          local_1d8._0_4_ = (float)uVar269;
          local_1d8._4_4_ = (float)((ulong)uVar269 >> 0x20);
          uStack_1d0._0_4_ = (float)uVar270;
          uStack_1d0._4_4_ = (float)((ulong)uVar270 >> 0x20);
          pfVar4 = (float *)((long)pfVar315 + lVar298 + 0x40);
          fVar330 = *pfVar4;
          fVar346 = pfVar4[1];
          fVar334 = pfVar4[2];
          fVar63 = pfVar4[3];
          pfVar4 = (float *)((long)pfVar313 + lVar298 + 0x40);
          fVar64 = *pfVar4;
          fVar65 = pfVar4[1];
          fVar74 = pfVar4[2];
          fVar75 = pfVar4[3];
          pfVar4 = (float *)((long)pfVar308 + lVar298 + 0x40);
          fVar76 = *pfVar4;
          fVar89 = pfVar4[1];
          fVar90 = pfVar4[2];
          fVar91 = pfVar4[3];
          pfVar4 = (float *)(pauVar302[1] + lVar298);
          *pfVar4 = fVar85 * fVar339 + (float)local_1d8 * local_268 + fVar359 * local_248 +
                    fVar81 * (float)local_1e8 + fVar77 * local_288 + fVar70 * local_2b8 +
                    fVar66 * local_278 + fVar367 * local_2a8 +
                    fVar357 * (float)local_2d8 + (float)local_2c8;
          pfVar4[1] = fVar86 * fVar341 + local_1d8._4_4_ * fStack_264 + fVar340 * fStack_244 +
                      fVar82 * local_1e8._4_4_ + fVar78 * fStack_284 + fVar71 * fStack_2b4 +
                      fVar67 * fStack_274 + fVar345 * fStack_2a4 +
                      fVar364 * local_2d8._4_4_ + local_2c8._4_4_;
          pfVar4[2] = fVar87 * fVar342 + (float)uStack_1d0 * fStack_260 + fVar61 * fStack_240 +
                      fVar83 * (float)uStack_1e0 + fVar79 * fStack_280 + fVar72 * fStack_2b0 +
                      fVar68 * fStack_270 + fVar356 * fStack_2a0 + fVar365 * fStack_2d0 + fStack_2c0
          ;
          pfVar4[3] = fVar88 * fVar343 + uStack_1d0._4_4_ * fStack_25c + fVar62 * fStack_23c +
                      fVar84 * uStack_1e0._4_4_ + fVar80 * fStack_27c + fVar73 * fStack_2ac +
                      fVar69 * fStack_26c + fVar358 * fStack_29c + fVar366 * fStack_2cc + fStack_2bc
          ;
          pfVar4 = (float *)((long)pfVar315 + lVar298 + 0x50);
          fVar357 = *pfVar4;
          fVar364 = pfVar4[1];
          fVar365 = pfVar4[2];
          fVar366 = pfVar4[3];
          pfVar4 = (float *)((long)pfVar313 + lVar298 + 0x50);
          fVar66 = *pfVar4;
          fVar67 = pfVar4[1];
          fVar68 = pfVar4[2];
          fVar69 = pfVar4[3];
          pfVar4 = (float *)((long)pfVar308 + lVar298 + 0x50);
          fVar77 = *pfVar4;
          fVar78 = pfVar4[1];
          fVar79 = pfVar4[2];
          fVar80 = pfVar4[3];
          pfVar4 = (float *)(pauVar302[2] + lVar298);
          *pfVar4 = fVar76 * fVar339 + fVar64 * local_268 + fVar330 * local_248 +
                    fVar85 * (float)local_1e8 + (float)local_1d8 * local_2b8 + fVar359 * local_2a8 +
                    fVar81 * local_288 + fVar70 * local_278 +
                    fVar367 * (float)local_2d8 + (float)local_2c8;
          pfVar4[1] = fVar89 * fVar341 + fVar65 * fStack_264 + fVar346 * fStack_244 +
                      fVar86 * local_1e8._4_4_ + local_1d8._4_4_ * fStack_2b4 + fVar340 * fStack_2a4
                      + fVar82 * fStack_284 + fVar71 * fStack_274 +
                        fVar345 * local_2d8._4_4_ + local_2c8._4_4_;
          pfVar4[2] = fVar90 * fVar342 + fVar74 * fStack_260 + fVar334 * fStack_240 +
                      fVar87 * (float)uStack_1e0 +
                      (float)uStack_1d0 * fStack_2b0 + fVar61 * fStack_2a0 +
                      fVar83 * fStack_280 + fVar72 * fStack_270 + fVar356 * fStack_2d0 + fStack_2c0;
          pfVar4[3] = fVar91 * fVar343 + fVar75 * fStack_25c + fVar63 * fStack_23c +
                      fVar88 * uStack_1e0._4_4_ +
                      uStack_1d0._4_4_ * fStack_2ac + fVar62 * fStack_29c +
                      fVar84 * fStack_27c + fVar73 * fStack_26c + fVar358 * fStack_2cc + fStack_2bc;
          fVar360 = (float)local_1d8 * local_278;
          fVar361 = local_1d8._4_4_ * fStack_274;
          fVar362 = (float)uStack_1d0 * fStack_270;
          fVar363 = uStack_1d0._4_4_ * fStack_26c;
          pfVar4 = (float *)((long)pfVar315 + lVar298 + 0x60);
          fVar367 = *pfVar4;
          fVar345 = pfVar4[1];
          fVar356 = pfVar4[2];
          fVar358 = pfVar4[3];
          pfVar4 = (float *)((long)pfVar313 + lVar298 + 0x60);
          fVar70 = *pfVar4;
          fVar71 = pfVar4[1];
          local_1d8 = *(long *)pfVar4;
          fVar72 = pfVar4[2];
          fVar73 = pfVar4[3];
          uStack_1d0 = *(long *)(pfVar4 + 2);
          pfVar4 = (float *)((long)pfVar308 + lVar298 + 0x60);
          fVar81 = *pfVar4;
          fVar82 = pfVar4[1];
          fVar83 = pfVar4[2];
          fVar84 = pfVar4[3];
          pfVar4 = (float *)(pauVar302[3] + lVar298);
          *pfVar4 = fVar77 * fVar339 + fVar66 * local_268 + fVar357 * local_248 +
                    fVar76 * (float)local_1e8 + fVar64 * local_2b8 + fVar330 * local_2a8 +
                    fVar85 * local_288 + fVar360 + fVar359 * (float)local_2d8 + (float)local_2c8;
          pfVar4[1] = fVar78 * fVar341 + fVar67 * fStack_264 + fVar364 * fStack_244 +
                      fVar89 * local_1e8._4_4_ + fVar65 * fStack_2b4 + fVar346 * fStack_2a4 +
                      fVar86 * fStack_284 + fVar361 + fVar340 * local_2d8._4_4_ + local_2c8._4_4_;
          pfVar4[2] = fVar79 * fVar342 + fVar68 * fStack_260 + fVar365 * fStack_240 +
                      fVar90 * (float)uStack_1e0 + fVar74 * fStack_2b0 + fVar334 * fStack_2a0 +
                      fVar87 * fStack_280 + fVar362 + fVar61 * fStack_2d0 + fStack_2c0;
          pfVar4[3] = fVar80 * fVar343 + fVar69 * fStack_25c + fVar366 * fStack_23c +
                      fVar91 * uStack_1e0._4_4_ + fVar75 * fStack_2ac + fVar63 * fStack_29c +
                      fVar88 * fStack_27c + fVar363 + fVar62 * fStack_2cc + fStack_2bc;
          pfVar4 = (float *)((long)pfVar315 + lVar298 + 0x70);
          fVar359 = *pfVar4;
          fVar340 = pfVar4[1];
          fVar61 = pfVar4[2];
          fVar62 = pfVar4[3];
          pfVar4 = (float *)((long)pfVar313 + lVar298 + 0x70);
          fVar85 = *pfVar4;
          fVar86 = pfVar4[1];
          fVar87 = pfVar4[2];
          fVar88 = pfVar4[3];
          pfVar4 = (float *)((long)pfVar308 + lVar298 + 0x70);
          fVar360 = *pfVar4;
          fVar361 = pfVar4[1];
          fVar362 = pfVar4[2];
          fVar363 = pfVar4[3];
          pfVar4 = (float *)(pauVar302[4] + lVar298);
          *pfVar4 = fVar81 * fVar339 + fVar70 * local_268 + fVar367 * local_248 +
                    fVar77 * (float)local_1e8 + fVar66 * local_2b8 + fVar357 * local_2a8 +
                    fVar76 * local_288 + fVar64 * local_278 +
                    fVar330 * (float)local_2d8 + (float)local_2c8;
          pfVar4[1] = fVar82 * fVar341 + fVar71 * fStack_264 + fVar345 * fStack_244 +
                      fVar78 * local_1e8._4_4_ + fVar67 * fStack_2b4 + fVar364 * fStack_2a4 +
                      fVar89 * fStack_284 + fVar65 * fStack_274 +
                      fVar346 * local_2d8._4_4_ + local_2c8._4_4_;
          pfVar4[2] = fVar83 * fVar342 + fVar72 * fStack_260 + fVar356 * fStack_240 +
                      fVar79 * (float)uStack_1e0 + fVar68 * fStack_2b0 + fVar365 * fStack_2a0 +
                      fVar90 * fStack_280 + fVar74 * fStack_270 + fVar334 * fStack_2d0 + fStack_2c0;
          pfVar4[3] = fVar84 * fVar343 + fVar73 * fStack_25c + fVar358 * fStack_23c +
                      fVar80 * uStack_1e0._4_4_ + fVar69 * fStack_2ac + fVar366 * fStack_29c +
                      fVar91 * fStack_27c + fVar75 * fStack_26c + fVar63 * fStack_2cc + fStack_2bc;
          pfVar4 = (float *)((long)pfVar315 + lVar298 + 0x80);
          fVar330 = *pfVar4;
          fVar346 = pfVar4[1];
          fVar334 = pfVar4[2];
          fVar63 = pfVar4[3];
          pfVar4 = (float *)((long)pfVar313 + lVar298 + 0x80);
          fVar64 = *pfVar4;
          fVar65 = pfVar4[1];
          fVar74 = pfVar4[2];
          fVar75 = pfVar4[3];
          pfVar4 = (float *)((long)pfVar308 + lVar298 + 0x80);
          fVar76 = *pfVar4;
          fVar89 = pfVar4[1];
          fVar90 = pfVar4[2];
          fVar91 = pfVar4[3];
          pfVar4 = (float *)(pauVar302[5] + lVar298);
          *pfVar4 = fVar360 * fVar339 + fVar85 * local_268 + fVar359 * local_248 +
                    fVar81 * (float)local_1e8 + fVar70 * local_2b8 + fVar367 * local_2a8 +
                    fVar77 * local_288 + fVar66 * local_278 +
                    fVar357 * (float)local_2d8 + (float)local_2c8;
          pfVar4[1] = fVar361 * fVar341 + fVar86 * fStack_264 + fVar340 * fStack_244 +
                      fVar82 * local_1e8._4_4_ + fVar71 * fStack_2b4 + fVar345 * fStack_2a4 +
                      fVar78 * fStack_284 + fVar67 * fStack_274 +
                      fVar364 * local_2d8._4_4_ + local_2c8._4_4_;
          pfVar4[2] = fVar362 * fVar342 + fVar87 * fStack_260 + fVar61 * fStack_240 +
                      fVar83 * (float)uStack_1e0 + fVar72 * fStack_2b0 + fVar356 * fStack_2a0 +
                      fVar79 * fStack_280 + fVar68 * fStack_270 + fVar365 * fStack_2d0 + fStack_2c0;
          pfVar4[3] = fVar363 * fVar343 + fVar88 * fStack_25c + fVar62 * fStack_23c +
                      fVar84 * uStack_1e0._4_4_ + fVar73 * fStack_2ac + fVar358 * fStack_29c +
                      fVar80 * fStack_27c + fVar69 * fStack_26c + fVar366 * fStack_2cc + fStack_2bc;
          pfVar4 = (float *)((long)pfVar315 + lVar298 + 0x90);
          fVar357 = *pfVar4;
          fVar364 = pfVar4[1];
          fVar365 = pfVar4[2];
          fVar366 = pfVar4[3];
          pfVar4 = (float *)((long)pfVar313 + lVar298 + 0x90);
          fVar66 = *pfVar4;
          fVar67 = pfVar4[1];
          fVar68 = pfVar4[2];
          fVar69 = pfVar4[3];
          pfVar4 = (float *)((long)pfVar308 + lVar298 + 0x90);
          fVar77 = *pfVar4;
          fVar78 = pfVar4[1];
          fVar79 = pfVar4[2];
          fVar80 = pfVar4[3];
          pfVar4 = (float *)(pauVar302[6] + lVar298);
          *pfVar4 = fVar76 * fVar339 + fVar64 * local_268 + fVar330 * auVar271._0_4_ +
                    fVar360 * (float)local_1e8 + fVar85 * local_2b8 + fVar359 * local_2a8 +
                    fVar81 * local_288 + fVar70 * local_278 +
                    fVar367 * (float)local_2d8 + (float)local_2c8;
          pfVar4[1] = fVar89 * fVar341 + fVar65 * fStack_264 + fVar346 * auVar271._4_4_ +
                      fVar361 * local_1e8._4_4_ + fVar86 * fStack_2b4 + fVar340 * fStack_2a4 +
                      fVar82 * fStack_284 + fVar71 * fStack_274 +
                      fVar345 * local_2d8._4_4_ + local_2c8._4_4_;
          pfVar4[2] = fVar90 * fVar342 + fVar74 * fStack_260 + fVar334 * auVar271._8_4_ +
                      fVar362 * (float)uStack_1e0 + fVar87 * fStack_2b0 + fVar61 * fStack_2a0 +
                      fVar83 * fStack_280 + fVar72 * fStack_270 + fVar356 * fStack_2d0 + fStack_2c0;
          pfVar4[3] = fVar91 * fVar343 + fVar75 * fStack_25c + fVar63 * fStack_23c +
                      fVar363 * uStack_1e0._4_4_ + fVar88 * fStack_2ac + fVar62 * fStack_29c +
                      fVar84 * fStack_27c + fVar73 * fStack_26c + fVar358 * fStack_2cc + fStack_2bc;
          pfVar4 = (float *)(pauVar302[7] + lVar298);
          *pfVar4 = fVar76 * (float)local_1e8 + fVar64 * local_2b8 + fVar330 * local_2a8 +
                    fVar360 * local_288 + fVar85 * local_278 +
                    fVar359 * (float)local_2d8 + (float)local_2c8 +
                    fVar77 * fVar339 + fVar66 * local_268 + fVar357 * auVar271._0_4_;
          pfVar4[1] = fVar89 * local_1e8._4_4_ + fVar65 * fStack_2b4 + fVar346 * fStack_2a4 +
                      fVar361 * fStack_284 + fVar86 * fStack_274 +
                      fVar340 * local_2d8._4_4_ + local_2c8._4_4_ +
                      fVar78 * fVar341 + fVar67 * fStack_264 + fVar364 * auVar271._4_4_;
          pfVar4[2] = fVar90 * (float)uStack_1e0 + fVar74 * fStack_2b0 + fVar334 * fStack_2a0 +
                      fVar362 * fStack_280 + fVar87 * fStack_270 + fVar61 * fStack_2d0 + fStack_2c0
                      + fVar79 * fVar342 + fVar68 * fStack_260 + fVar365 * auVar271._8_4_;
          pfVar4[3] = fVar91 * uStack_1e0._4_4_ + fVar75 * fStack_2ac + fVar63 * fStack_29c +
                      fVar363 * fStack_27c + fVar88 * fStack_26c + fVar62 * fStack_2cc + fStack_2bc
                      + fVar80 * fVar343 + fVar69 * fStack_25c + fVar366 * fStack_23c;
          iVar312 = iVar312 + 8;
          lVar298 = lVar298 + 0x80;
          pfVar317 = pfVar317 + 0x20;
          pfVar293 = pfVar293 + 0x20;
          pfVar291 = pfVar291 + 0x20;
        }
        for (; iVar312 + 3 < iVar281; iVar312 = iVar312 + 4) {
          pfVar27 = (float *)((long)pfVar315 + lVar298);
          fVar330 = pfVar27[1];
          fVar346 = pfVar27[2];
          fVar334 = pfVar27[3];
          pfVar4 = (float *)((long)pfVar315 + lVar298 + 0x10);
          fVar357 = *pfVar4;
          fVar364 = pfVar4[1];
          fVar365 = pfVar4[2];
          fVar366 = pfVar4[3];
          pfVar4 = (float *)((long)pfVar315 + lVar298 + 0x20);
          fVar367 = *pfVar4;
          fVar345 = pfVar4[1];
          fVar356 = pfVar4[2];
          fVar358 = pfVar4[3];
          pfVar4 = (float *)((long)pfVar315 + lVar298 + 0x30);
          fVar359 = *pfVar4;
          fVar340 = pfVar4[1];
          fVar61 = pfVar4[2];
          fVar62 = pfVar4[3];
          pfVar28 = (float *)((long)pfVar313 + lVar298);
          fVar63 = pfVar28[1];
          fVar64 = pfVar28[2];
          fVar65 = pfVar28[3];
          pfVar4 = (float *)((long)pfVar313 + lVar298 + 0x10);
          fVar66 = *pfVar4;
          fVar67 = pfVar4[1];
          fVar68 = pfVar4[2];
          fVar69 = pfVar4[3];
          pfVar4 = (float *)((long)pfVar313 + lVar298 + 0x20);
          fVar70 = *pfVar4;
          fVar71 = pfVar4[1];
          fVar72 = pfVar4[2];
          fVar73 = pfVar4[3];
          pfVar4 = (float *)((long)pfVar313 + lVar298 + 0x30);
          fVar74 = *pfVar4;
          fVar75 = pfVar4[1];
          local_1d8 = *(long *)pfVar4;
          fVar76 = pfVar4[2];
          fVar77 = pfVar4[3];
          uStack_1d0 = *(long *)(pfVar4 + 2);
          pfVar4 = (float *)((long)pfVar308 + lVar298);
          fVar78 = pfVar4[1];
          fVar79 = pfVar4[2];
          fVar80 = pfVar4[3];
          pfVar5 = (float *)((long)pfVar308 + lVar298 + 0x10);
          fVar81 = *pfVar5;
          fVar82 = pfVar5[1];
          fVar83 = pfVar5[2];
          fVar84 = pfVar5[3];
          pfVar5 = (float *)((long)pfVar308 + lVar298 + 0x20);
          fVar85 = *pfVar5;
          fVar86 = pfVar5[1];
          fVar87 = pfVar5[2];
          fVar88 = pfVar5[3];
          pfVar5 = (float *)((long)pfVar308 + lVar298 + 0x30);
          fVar89 = *pfVar5;
          fVar90 = pfVar5[1];
          fVar91 = pfVar5[2];
          fVar360 = pfVar5[3];
          pfVar5 = (float *)((long)*pauVar302 + lVar298);
          *pfVar5 = fVar85 * fVar339 + fVar81 * (float)local_1e8 + *pfVar4 * local_288 +
                    fVar70 * local_268 + fVar66 * local_2b8 + *pfVar28 * local_278 +
                    fVar367 * local_248 + fVar357 * local_2a8 +
                    *pfVar27 * (float)local_2d8 + (float)local_2c8;
          pfVar5[1] = fVar86 * fVar341 + fVar82 * local_1e8._4_4_ + fVar78 * fStack_284 +
                      fVar71 * fStack_264 + fVar67 * fStack_2b4 + fVar63 * fStack_274 +
                      fVar345 * fStack_244 + fVar364 * fStack_2a4 +
                      fVar330 * local_2d8._4_4_ + local_2c8._4_4_;
          pfVar5[2] = fVar87 * fVar342 + fVar83 * (float)uStack_1e0 + fVar79 * fStack_280 +
                      fVar72 * fStack_260 + fVar68 * fStack_2b0 + fVar64 * fStack_270 +
                      fVar356 * fStack_240 + fVar365 * fStack_2a0 +
                      fVar346 * fStack_2d0 + fStack_2c0;
          pfVar5[3] = fVar88 * fVar343 + fVar84 * uStack_1e0._4_4_ + fVar80 * fStack_27c +
                      fVar73 * fStack_25c + fVar69 * fStack_2ac + fVar65 * fStack_26c +
                      fVar358 * fStack_23c + fVar366 * fStack_29c +
                      fVar334 * fStack_2cc + fStack_2bc;
          pfVar4 = (float *)((long)pfVar315 + lVar298 + 0x40);
          fVar330 = *pfVar4;
          fVar346 = pfVar4[1];
          fVar334 = pfVar4[2];
          fVar63 = pfVar4[3];
          pfVar4 = (float *)((long)pfVar313 + lVar298 + 0x40);
          fVar64 = *pfVar4;
          fVar65 = pfVar4[1];
          fVar78 = pfVar4[2];
          fVar79 = pfVar4[3];
          pfVar4 = (float *)((long)pfVar308 + lVar298 + 0x40);
          fVar80 = *pfVar4;
          fVar361 = pfVar4[1];
          fVar362 = pfVar4[2];
          fVar363 = pfVar4[3];
          pfVar4 = (float *)(pauVar302[1] + lVar298);
          *pfVar4 = fVar89 * fVar339 + fVar74 * local_268 + fVar359 * local_248 +
                    fVar85 * (float)local_1e8 + fVar81 * local_288 + fVar70 * local_2b8 +
                    fVar66 * local_278 + fVar367 * local_2a8 +
                    fVar357 * (float)local_2d8 + (float)local_2c8;
          pfVar4[1] = fVar90 * fVar341 + fVar75 * fStack_264 + fVar340 * fStack_244 +
                      fVar86 * local_1e8._4_4_ + fVar82 * fStack_284 + fVar71 * fStack_2b4 +
                      fVar67 * fStack_274 + fVar345 * fStack_2a4 +
                      fVar364 * local_2d8._4_4_ + local_2c8._4_4_;
          pfVar4[2] = fVar91 * fVar342 + fVar76 * fStack_260 + fVar61 * fStack_240 +
                      fVar87 * (float)uStack_1e0 + fVar83 * fStack_280 + fVar72 * fStack_2b0 +
                      fVar68 * fStack_270 + fVar356 * fStack_2a0 + fVar365 * fStack_2d0 + fStack_2c0
          ;
          pfVar4[3] = fVar360 * fVar343 + fVar77 * fStack_25c + fVar62 * fStack_23c +
                      fVar88 * uStack_1e0._4_4_ + fVar84 * fStack_27c + fVar73 * fStack_2ac +
                      fVar69 * fStack_26c + fVar358 * fStack_29c + fVar366 * fStack_2cc + fStack_2bc
          ;
          fVar344 = (float)uVar273;
          fVar355 = (float)((ulong)uVar273 >> 0x20);
          pfVar4 = (float *)((long)pfVar315 + lVar298 + 0x50);
          fVar357 = *pfVar4;
          fVar364 = pfVar4[1];
          fVar365 = pfVar4[2];
          fVar366 = pfVar4[3];
          pfVar4 = (float *)((long)pfVar313 + lVar298 + 0x50);
          fVar66 = *pfVar4;
          fVar67 = pfVar4[1];
          fVar68 = pfVar4[2];
          fVar69 = pfVar4[3];
          pfVar4 = (float *)((long)pfVar308 + lVar298 + 0x50);
          fVar81 = *pfVar4;
          fVar82 = pfVar4[1];
          fVar83 = pfVar4[2];
          fVar84 = pfVar4[3];
          pfVar4 = (float *)(pauVar302[2] + lVar298);
          *pfVar4 = fVar80 * fVar344 + fVar64 * local_268 + fVar330 * local_248 +
                    fVar89 * (float)local_1e8 + fVar74 * local_2b8 + fVar359 * local_2a8 +
                    fVar85 * local_288 + fVar70 * local_278 +
                    fVar367 * (float)local_2d8 + (float)local_2c8;
          pfVar4[1] = fVar361 * fVar355 + fVar65 * fStack_264 + fVar346 * fStack_244 +
                      fVar90 * local_1e8._4_4_ + fVar75 * fStack_2b4 + fVar340 * fStack_2a4 +
                      fVar86 * fStack_284 + fVar71 * fStack_274 +
                      fVar345 * local_2d8._4_4_ + local_2c8._4_4_;
          pfVar4[2] = fVar362 * fVar342 + fVar78 * fStack_260 + fVar334 * fStack_240 +
                      fVar91 * (float)uStack_1e0 + fVar76 * fStack_2b0 + fVar61 * fStack_2a0 +
                      fVar87 * fStack_280 + fVar72 * fStack_270 + fVar356 * fStack_2d0 + fStack_2c0;
          pfVar4[3] = fVar363 * fVar343 + fVar79 * fStack_25c + fVar63 * fStack_23c +
                      fVar360 * uStack_1e0._4_4_ + fVar77 * fStack_2ac + fVar62 * fStack_29c +
                      fVar88 * fStack_27c + fVar73 * fStack_26c + fVar358 * fStack_2cc + fStack_2bc;
          auVar331._0_4_ =
               fVar80 * (float)local_1e8 + fVar64 * local_2b8 + fVar330 * local_2a8 +
               fVar89 * local_288 + fVar74 * local_278 +
               fVar359 * (float)local_2d8 + (float)local_2c8 +
               fVar81 * fVar344 + fVar66 * local_268 + fVar357 * local_248;
          auVar331._4_4_ =
               fVar361 * local_1e8._4_4_ + fVar65 * fStack_2b4 + fVar346 * fStack_2a4 +
               fVar90 * fStack_284 + fVar75 * fStack_274 +
               fVar340 * local_2d8._4_4_ + local_2c8._4_4_ +
               fVar82 * fVar355 + fVar67 * fStack_264 + fVar364 * fStack_244;
          auVar331._8_4_ =
               fVar362 * (float)uStack_1e0 + fVar78 * fStack_2b0 + fVar334 * fStack_2a0 +
               fVar91 * fStack_280 + fVar76 * fStack_270 + fVar61 * fStack_2d0 + fStack_2c0 +
               fVar83 * fVar342 + fVar68 * fStack_260 + fVar365 * fStack_240;
          auVar331._12_4_ =
               fVar363 * uStack_1e0._4_4_ + fVar79 * fStack_2ac + fVar63 * fStack_29c +
               fVar360 * fStack_27c + fVar77 * fStack_26c + fVar62 * fStack_2cc + fStack_2bc +
               fVar84 * fVar343 + fVar69 * fStack_25c + fVar366 * fStack_23c;
          *(undefined1 (*) [16])(pauVar302[3] + lVar298) = auVar331;
          lVar298 = lVar298 + 0x40;
          pfVar317 = pfVar317 + 0x10;
          pfVar293 = pfVar293 + 0x10;
          pfVar291 = pfVar291 + 0x10;
        }
        for (; iVar312 + 1 < iVar281; iVar312 = iVar312 + 2) {
          pfVar4 = (float *)((long)pfVar315 + lVar298 + 0x10);
          fVar330 = *pfVar4;
          fVar346 = pfVar4[1];
          fVar334 = pfVar4[2];
          fVar357 = pfVar4[3];
          pfVar4 = (float *)((long)pfVar315 + lVar298 + 0x20);
          fVar364 = *pfVar4;
          fVar365 = pfVar4[1];
          fVar366 = pfVar4[2];
          fVar367 = pfVar4[3];
          pfVar4 = (float *)((long)pfVar313 + lVar298 + 0x10);
          fVar345 = *pfVar4;
          fVar356 = pfVar4[1];
          fVar358 = pfVar4[2];
          fVar359 = pfVar4[3];
          pfVar4 = (float *)((long)pfVar313 + lVar298 + 0x20);
          fVar340 = *pfVar4;
          fVar61 = pfVar4[1];
          fVar62 = pfVar4[2];
          fVar63 = pfVar4[3];
          pfVar4 = (float *)((long)pfVar308 + lVar298 + 0x10);
          fVar64 = *pfVar4;
          fVar65 = pfVar4[1];
          fVar66 = pfVar4[2];
          fVar67 = pfVar4[3];
          pfVar4 = (float *)((long)pfVar308 + lVar298 + 0x20);
          fVar68 = *pfVar4;
          fVar69 = pfVar4[1];
          fVar70 = pfVar4[2];
          fVar71 = pfVar4[3];
          pfVar27 = (float *)((long)pfVar315 + lVar298);
          fVar72 = pfVar27[1];
          fVar73 = pfVar27[2];
          fVar74 = pfVar27[3];
          pfVar28 = (float *)((long)pfVar313 + lVar298);
          fVar75 = pfVar28[1];
          fVar76 = pfVar28[2];
          fVar77 = pfVar28[3];
          pfVar4 = (float *)((long)pfVar308 + lVar298);
          fVar78 = pfVar4[1];
          fVar79 = pfVar4[2];
          fVar80 = pfVar4[3];
          fVar361 = (float)uVar274;
          fVar362 = (float)((ulong)uVar274 >> 0x20);
          pfVar5 = (float *)((long)pfVar315 + lVar298 + 0x30);
          fVar81 = *pfVar5;
          fVar82 = pfVar5[1];
          fVar83 = pfVar5[2];
          fVar84 = pfVar5[3];
          pfVar5 = (float *)((long)pfVar313 + lVar298 + 0x30);
          fVar85 = *pfVar5;
          fVar86 = pfVar5[1];
          fVar87 = pfVar5[2];
          fVar88 = pfVar5[3];
          pfVar5 = (float *)((long)pfVar308 + lVar298 + 0x30);
          fVar89 = *pfVar5;
          fVar90 = pfVar5[1];
          fVar91 = pfVar5[2];
          fVar360 = pfVar5[3];
          pfVar5 = (float *)((long)*pauVar302 + lVar298);
          *pfVar5 = fVar68 * fVar361 + fVar64 * (float)local_1e8 + *pfVar4 * local_288 +
                    fVar340 * local_268 + fVar345 * local_2b8 + *pfVar28 * local_278 +
                    fVar364 * auVar272._0_4_ + fVar330 * local_2a8 +
                    *pfVar27 * (float)local_2d8 + (float)local_2c8;
          pfVar5[1] = fVar69 * fVar362 + fVar65 * local_1e8._4_4_ + fVar78 * fStack_284 +
                      fVar61 * fStack_264 + fVar356 * fStack_2b4 + fVar75 * fStack_274 +
                      fVar365 * auVar272._4_4_ + fVar346 * fStack_2a4 +
                      fVar72 * local_2d8._4_4_ + local_2c8._4_4_;
          pfVar5[2] = fVar70 * fVar342 + fVar66 * (float)uStack_1e0 + fVar79 * fStack_280 +
                      fVar62 * fStack_260 + fVar358 * fStack_2b0 + fVar76 * fStack_270 +
                      fVar366 * auVar272._8_4_ + fVar334 * fStack_2a0 +
                      fVar73 * fStack_2d0 + fStack_2c0;
          pfVar5[3] = fVar71 * fVar343 + fVar67 * uStack_1e0._4_4_ + fVar80 * fStack_27c +
                      fVar63 * fStack_25c + fVar359 * fStack_2ac + fVar77 * fStack_26c +
                      fVar367 * fStack_23c + fVar357 * fStack_29c + fVar74 * fStack_2cc + fStack_2bc
          ;
          auVar326._0_4_ =
               fVar68 * (float)local_1e8 + fVar64 * local_288 + fVar340 * local_2b8 +
               fVar345 * local_278 + fVar364 * local_2a8 +
               fVar330 * (float)local_2d8 + (float)local_2c8 +
               fVar89 * fVar361 + fVar85 * local_268 + fVar81 * auVar272._0_4_;
          auVar326._4_4_ =
               fVar69 * local_1e8._4_4_ + fVar65 * fStack_284 + fVar61 * fStack_2b4 +
               fVar356 * fStack_274 + fVar365 * fStack_2a4 +
               fVar346 * local_2d8._4_4_ + local_2c8._4_4_ +
               fVar90 * fVar362 + fVar86 * fStack_264 + fVar82 * auVar272._4_4_;
          auVar326._8_4_ =
               fVar70 * (float)uStack_1e0 + fVar66 * fStack_280 + fVar62 * fStack_2b0 +
               fVar358 * fStack_270 + fVar366 * fStack_2a0 + fVar334 * fStack_2d0 + fStack_2c0 +
               fVar91 * fVar342 + fVar87 * fStack_260 + fVar83 * auVar272._8_4_;
          auVar326._12_4_ =
               fVar71 * uStack_1e0._4_4_ + fVar67 * fStack_27c + fVar63 * fStack_2ac +
               fVar359 * fStack_26c + fVar367 * fStack_29c + fVar357 * fStack_2cc + fStack_2bc +
               fVar360 * fVar343 + fVar88 * fStack_25c + fVar84 * fStack_23c;
          *(undefined1 (*) [16])(pauVar302[1] + lVar298) = auVar326;
          lVar298 = lVar298 + 0x20;
          pfVar317 = pfVar317 + 8;
          pfVar293 = pfVar293 + 8;
          pfVar291 = pfVar291 + 8;
        }
        pauVar302 = (undefined1 (*) [16])((long)*pauVar302 + lVar298);
        pfVar315 = pfVar317;
        for (; iVar312 < iVar281; iVar312 = iVar312 + 1) {
          auVar327._0_4_ =
               *pfVar291 * fVar339 + pfVar291[-4] * (float)local_1e8 + pfVar291[-8] * local_288 +
               *pfVar293 * local_268 + pfVar293[-4] * local_2b8 + pfVar293[-8] * local_278 +
               *pfVar315 * local_248 + pfVar315[-4] * local_2a8 +
               pfVar315[-8] * (float)local_2d8 + (float)local_2c8;
          auVar327._4_4_ =
               pfVar291[1] * fVar341 + pfVar291[-3] * local_1e8._4_4_ + pfVar291[-7] * fStack_284 +
               pfVar293[1] * fStack_264 + pfVar293[-3] * fStack_2b4 + pfVar293[-7] * fStack_274 +
               pfVar315[1] * fStack_244 + pfVar315[-3] * fStack_2a4 +
               pfVar315[-7] * local_2d8._4_4_ + local_2c8._4_4_;
          auVar327._8_4_ =
               pfVar291[2] * fVar342 + pfVar291[-2] * (float)uStack_1e0 + pfVar291[-6] * fStack_280
               + pfVar293[2] * fStack_260 + pfVar293[-2] * fStack_2b0 + pfVar293[-6] * fStack_270 +
                 pfVar315[2] * fStack_240 + pfVar315[-2] * fStack_2a0 +
                 pfVar315[-6] * fStack_2d0 + fStack_2c0;
          auVar327._12_4_ =
               pfVar291[3] * fVar343 + pfVar291[-1] * uStack_1e0._4_4_ + pfVar291[-5] * fStack_27c +
               pfVar293[3] * fStack_25c + pfVar293[-1] * fStack_2ac + pfVar293[-5] * fStack_26c +
               pfVar315[3] * fStack_23c + pfVar315[-1] * fStack_29c +
               pfVar315[-5] * fStack_2cc + fStack_2bc;
          *pauVar302 = auVar327;
          pauVar302 = pauVar302 + 1;
          pfVar315 = pfVar315 + 4;
          pfVar293 = pfVar293 + 4;
          pfVar291 = pfVar291 + 4;
        }
        pfVar313 = pfVar293;
        pfVar308 = pfVar291;
      }
      local_1e8 = lVar300;
      uStack_1e0 = lVar294;
    }
LAB_003b1488:
    pLVar54 = this->activation;
    if (pLVar54 != (Layer *)0x0) {
      (*pLVar54->_vptr_Layer[9])(pLVar54,top_blob,opt);
    }
  }
  else {
    bVar280 = (byte)iVar283;
    if ((iVar287 == 2 && iVar281 == 2) && bVar280 == 0xf) {
      iVar281 = top_blob->w;
      pvVar311 = (this->super_ConvolutionDepthWise).bias_data.data;
      uVar299 = 0;
      uVar314 = (ulong)(uint)top_blob->h;
      if (top_blob->h < 1) {
        uVar314 = uVar299;
      }
      uVar288 = (ulong)(uint)local_238.c;
      if (local_238.c < 1) {
        uVar288 = uVar299;
      }
      lVar300 = (long)((local_238.w - iVar281) * 8) * 4;
      for (; uVar299 != uVar288; uVar299 = uVar299 + 1) {
        if (pvVar311 == (void *)0x0) {
          fVar339 = 0.0;
          fVar341 = 0.0;
          fVar342 = 0.0;
          fVar343 = 0.0;
        }
        else {
          pfVar313 = (float *)((long)pvVar311 + uVar299 * 0x10);
          fVar339 = *pfVar313;
          fVar341 = pfVar313[1];
          fVar342 = pfVar313[2];
          fVar343 = pfVar313[3];
        }
        pauVar302 = (undefined1 (*) [16])
                    (top_blob->cstep * uVar299 * top_blob->elemsize + (long)top_blob->data);
        pvVar52 = (this->weight_data_tm).data;
        lVar298 = (long)(this->weight_data_tm).w * uVar299 * (this->weight_data_tm).elemsize;
        piVar306 = (pointer)(local_238.cstep * uVar299 *
                             CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize) +
                            (long)local_238.data);
        lVar294 = (long)local_238.w *
                  CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize);
        piVar310 = (pointer)((long)piVar306 + lVar294);
        pvVar295 = (void *)((long)piVar306 + lVar294 * 2);
        pfVar313 = (float *)((long)pvVar52 + lVar298);
        fVar330 = *pfVar313;
        fVar346 = pfVar313[1];
        fVar334 = pfVar313[2];
        fVar357 = pfVar313[3];
        pfVar313 = (float *)((long)pvVar52 + lVar298 + 0x10);
        fVar364 = *pfVar313;
        fVar365 = pfVar313[1];
        fVar366 = pfVar313[2];
        fVar367 = pfVar313[3];
        puVar1 = (undefined8 *)((long)pvVar52 + lVar298 + 0x20);
        uVar321 = *puVar1;
        uVar324 = puVar1[1];
        pfVar313 = (float *)((long)pvVar52 + lVar298 + 0x30);
        fVar345 = *pfVar313;
        fVar356 = pfVar313[1];
        fVar358 = pfVar313[2];
        fVar359 = pfVar313[3];
        pfVar313 = (float *)((long)pvVar52 + lVar298 + 0x40);
        fVar340 = *pfVar313;
        fVar61 = pfVar313[1];
        fVar62 = pfVar313[2];
        fVar63 = pfVar313[3];
        puVar1 = (undefined8 *)((long)pvVar52 + lVar298 + 0x50);
        uVar257 = *puVar1;
        uVar258 = puVar1[1];
        puVar1 = (undefined8 *)((long)pvVar52 + lVar298 + 0x60);
        uVar259 = *puVar1;
        uVar260 = puVar1[1];
        puVar1 = (undefined8 *)((long)pvVar52 + lVar298 + 0x70);
        uVar261 = *puVar1;
        uVar262 = puVar1[1];
        pfVar313 = (float *)((long)pvVar52 + lVar298 + 0x80);
        fVar64 = *pfVar313;
        uVar263 = *(undefined8 *)pfVar313;
        fVar65 = pfVar313[2];
        uVar264 = *(undefined8 *)(pfVar313 + 2);
        local_298 = (float)uVar321;
        fStack_294 = (float)((ulong)uVar321 >> 0x20);
        fStack_290 = (float)uVar324;
        fStack_28c = (float)((ulong)uVar324 >> 0x20);
        for (iVar304 = 0; iVar304 != (int)uVar314; iVar304 = iVar304 + 1) {
          lVar294 = 0;
          iVar312 = 0;
          while( true ) {
            local_278 = (float)uVar257;
            fStack_274 = (float)((ulong)uVar257 >> 0x20);
            fStack_270 = (float)uVar258;
            fStack_26c = (float)((ulong)uVar258 >> 0x20);
            local_268 = (float)uVar259;
            fStack_264 = (float)((ulong)uVar259 >> 0x20);
            fStack_260 = (float)uVar260;
            fStack_25c = (float)((ulong)uVar260 >> 0x20);
            fStack_2b4 = (float)((ulong)uVar261 >> 0x20);
            fStack_2ac = (float)((ulong)uVar262 >> 0x20);
            fStack_284 = (float)((ulong)uVar263 >> 0x20);
            fStack_27c = (float)((ulong)uVar264 >> 0x20);
            local_2b8 = (float)uVar261;
            fStack_2b0 = (float)uVar262;
            if (iVar281 <= iVar312 + 3) break;
            pfVar313 = (float *)((long)piVar306 + lVar294);
            fVar66 = pfVar313[1];
            fVar67 = pfVar313[2];
            fVar68 = pfVar313[3];
            pfVar317 = (float *)((long)piVar306 + lVar294 + 0x10);
            fVar69 = pfVar317[1];
            fVar70 = pfVar317[2];
            fVar71 = pfVar317[3];
            pfVar308 = (float *)((long)piVar306 + lVar294 + 0x20);
            fVar72 = *pfVar308;
            fVar73 = pfVar308[1];
            fVar74 = pfVar308[2];
            fVar75 = pfVar308[3];
            pfVar308 = (float *)((long)piVar306 + lVar294 + 0x40);
            fVar76 = *pfVar308;
            fVar77 = pfVar308[1];
            fVar78 = pfVar308[2];
            fVar79 = pfVar308[3];
            pfVar308 = (float *)((long)piVar310 + lVar294);
            fVar80 = pfVar308[1];
            fVar81 = pfVar308[2];
            fVar82 = pfVar308[3];
            pfVar293 = (float *)((long)piVar310 + lVar294 + 0x10);
            fVar83 = pfVar293[1];
            fVar84 = pfVar293[2];
            fVar85 = pfVar293[3];
            pfVar315 = (float *)((long)piVar310 + lVar294 + 0x20);
            fVar86 = *pfVar315;
            fVar87 = pfVar315[1];
            fVar88 = pfVar315[2];
            fVar89 = pfVar315[3];
            pfVar315 = (float *)((long)piVar310 + lVar294 + 0x40);
            fVar90 = *pfVar315;
            fVar91 = pfVar315[1];
            fVar360 = pfVar315[2];
            fVar361 = pfVar315[3];
            pfVar315 = (float *)((long)pvVar295 + lVar294);
            fVar362 = pfVar315[1];
            fVar363 = pfVar315[2];
            fVar344 = pfVar315[3];
            pfVar291 = (float *)((long)pvVar295 + lVar294 + 0x10);
            fVar355 = pfVar291[1];
            fVar92 = pfVar291[2];
            fVar93 = pfVar291[3];
            pfVar4 = (float *)((long)pvVar295 + lVar294 + 0x20);
            fVar94 = *pfVar4;
            fVar95 = pfVar4[1];
            fVar96 = pfVar4[2];
            fVar97 = pfVar4[3];
            pfVar4 = (float *)((long)pvVar295 + lVar294 + 0x40);
            fVar98 = *pfVar4;
            fVar99 = pfVar4[1];
            fVar100 = pfVar4[2];
            fVar101 = pfVar4[3];
            pfVar4 = (float *)((long)piVar306 + lVar294 + 0x30);
            fVar102 = *pfVar4;
            fVar103 = pfVar4[1];
            fVar104 = pfVar4[2];
            fVar105 = pfVar4[3];
            pfVar4 = (float *)((long)piVar310 + lVar294 + 0x30);
            fVar106 = *pfVar4;
            fVar107 = pfVar4[1];
            fVar108 = pfVar4[2];
            fVar109 = pfVar4[3];
            pfVar4 = (float *)((long)pvVar295 + lVar294 + 0x30);
            fVar110 = *pfVar4;
            fVar111 = pfVar4[1];
            fVar112 = pfVar4[2];
            fVar113 = pfVar4[3];
            *(float *)*pauVar302 =
                 fVar94 * fVar64 + *pfVar291 * local_2b8 + *pfVar315 * local_268 +
                 fVar86 * local_278 + *pfVar293 * fVar340 + *pfVar308 * fVar345 +
                 fVar72 * local_298 + *pfVar317 * fVar364 + *pfVar313 * fVar330 + fVar339;
            *(float *)((long)*pauVar302 + 4) =
                 fVar95 * fStack_284 + fVar355 * fStack_2b4 + fVar362 * fStack_264 +
                 fVar87 * fStack_274 + fVar83 * fVar61 + fVar80 * fVar356 +
                 fVar73 * fStack_294 + fVar69 * fVar365 + fVar66 * fVar346 + fVar341;
            *(float *)((long)*pauVar302 + 8) =
                 fVar96 * fVar65 + fVar92 * fStack_2b0 + fVar363 * fStack_260 +
                 fVar88 * fStack_270 + fVar84 * fVar62 + fVar81 * fVar358 +
                 fVar74 * fStack_290 + fVar70 * fVar366 + fVar67 * fVar334 + fVar342;
            *(float *)((long)*pauVar302 + 0xc) =
                 fVar97 * fStack_27c + fVar93 * fStack_2ac + fVar344 * fStack_25c +
                 fVar89 * fStack_26c + fVar85 * fVar63 + fVar82 * fVar359 +
                 fVar75 * fStack_28c + fVar71 * fVar367 + fVar68 * fVar357 + fVar343;
            pfVar313 = (float *)((long)piVar306 + lVar294 + 0x60);
            fVar66 = *pfVar313;
            fVar67 = pfVar313[1];
            fVar68 = pfVar313[2];
            fVar69 = pfVar313[3];
            pfVar313 = (float *)((long)piVar310 + lVar294 + 0x60);
            fVar70 = *pfVar313;
            fVar71 = pfVar313[1];
            fVar80 = pfVar313[2];
            fVar81 = pfVar313[3];
            pfVar313 = (float *)((long)pvVar295 + lVar294 + 0x60);
            fVar82 = *pfVar313;
            fVar83 = pfVar313[1];
            fVar84 = pfVar313[2];
            fVar85 = pfVar313[3];
            pfVar313 = (float *)((long)piVar306 + lVar294 + 0x50);
            fVar362 = *pfVar313;
            fVar363 = pfVar313[1];
            fVar344 = pfVar313[2];
            fVar355 = pfVar313[3];
            pfVar313 = (float *)((long)piVar310 + lVar294 + 0x50);
            fVar92 = *pfVar313;
            fVar93 = pfVar313[1];
            fVar114 = pfVar313[2];
            fVar115 = pfVar313[3];
            pfVar313 = (float *)((long)pvVar295 + lVar294 + 0x50);
            fVar116 = *pfVar313;
            fVar117 = pfVar313[1];
            fVar118 = pfVar313[2];
            fVar119 = pfVar313[3];
            *(float *)pauVar302[1] =
                 fVar98 * fVar64 + fVar90 * local_278 + fVar76 * local_298 +
                 fVar94 * local_268 + fVar86 * fVar345 + fVar72 * fVar330 + fVar339 +
                 fVar110 * local_2b8 + fVar106 * fVar340 + fVar102 * fVar364;
            *(float *)(pauVar302[1] + 4) =
                 fVar99 * fStack_284 + fVar91 * fStack_274 + fVar77 * fStack_294 +
                 fVar95 * fStack_264 + fVar87 * fVar356 + fVar73 * fVar346 + fVar341 +
                 fVar111 * fStack_2b4 + fVar107 * fVar61 + fVar103 * fVar365;
            *(float *)(pauVar302[1] + 8) =
                 fVar100 * fVar65 + fVar360 * fStack_270 + fVar78 * fStack_290 +
                 fVar96 * fStack_260 + fVar88 * fVar358 + fVar74 * fVar334 + fVar342 +
                 fVar112 * fStack_2b0 + fVar108 * fVar62 + fVar104 * fVar366;
            *(float *)(pauVar302[1] + 0xc) =
                 fVar101 * fStack_27c + fVar361 * fStack_26c + fVar79 * fStack_28c +
                 fVar97 * fStack_25c + fVar89 * fVar359 + fVar75 * fVar357 + fVar343 +
                 fVar113 * fStack_2ac + fVar109 * fVar63 + fVar105 * fVar367;
            pfVar313 = (float *)((long)piVar306 + lVar294 + 0x70);
            fVar72 = *pfVar313;
            fVar73 = pfVar313[1];
            fVar74 = pfVar313[2];
            fVar75 = pfVar313[3];
            pfVar313 = (float *)((long)piVar306 + lVar294 + 0x80);
            fVar86 = *pfVar313;
            fVar87 = pfVar313[1];
            fVar88 = pfVar313[2];
            fVar89 = pfVar313[3];
            pfVar313 = (float *)((long)piVar310 + lVar294 + 0x70);
            fVar94 = *pfVar313;
            fVar95 = pfVar313[1];
            fVar96 = pfVar313[2];
            fVar97 = pfVar313[3];
            pfVar313 = (float *)((long)piVar310 + lVar294 + 0x80);
            fVar102 = *pfVar313;
            fVar103 = pfVar313[1];
            fVar104 = pfVar313[2];
            fVar105 = pfVar313[3];
            pfVar313 = (float *)((long)pvVar295 + lVar294 + 0x70);
            fVar106 = *pfVar313;
            fVar107 = pfVar313[1];
            fVar108 = pfVar313[2];
            fVar109 = pfVar313[3];
            pfVar313 = (float *)((long)pvVar295 + lVar294 + 0x80);
            fVar110 = *pfVar313;
            fVar111 = pfVar313[1];
            fVar112 = pfVar313[2];
            fVar113 = pfVar313[3];
            *(float *)pauVar302[2] =
                 fVar82 * fVar64 + fVar70 * local_278 + fVar66 * local_298 +
                 fVar98 * local_268 + fVar90 * fVar345 + fVar76 * fVar330 + fVar339 +
                 fVar116 * local_2b8 + fVar92 * fVar340 + fVar362 * fVar364;
            *(float *)(pauVar302[2] + 4) =
                 fVar83 * fStack_284 + fVar71 * fStack_274 + fVar67 * fStack_294 +
                 fVar99 * fStack_264 + fVar91 * fVar356 + fVar77 * fVar346 + fVar341 +
                 fVar117 * fStack_2b4 + fVar93 * fVar61 + fVar363 * fVar365;
            *(float *)(pauVar302[2] + 8) =
                 fVar84 * fVar65 + fVar80 * fStack_270 + fVar68 * fStack_290 +
                 fVar100 * fStack_260 + fVar360 * fVar358 + fVar78 * fVar334 + fVar342 +
                 fVar118 * fStack_2b0 + fVar114 * fVar62 + fVar344 * fVar366;
            *(float *)(pauVar302[2] + 0xc) =
                 fVar85 * fStack_27c + fVar81 * fStack_26c + fVar69 * fStack_28c +
                 fVar101 * fStack_25c + fVar361 * fVar359 + fVar79 * fVar357 + fVar343 +
                 fVar119 * fStack_2ac + fVar115 * fVar63 + fVar355 * fVar367;
            *(float *)pauVar302[3] =
                 fVar82 * local_268 + fVar70 * fVar345 + fVar66 * fVar330 + fVar339 +
                 fVar106 * local_2b8 + fVar94 * fVar340 + fVar72 * fVar364 +
                 fVar110 * fVar64 + fVar102 * local_278 + fVar86 * local_298;
            *(float *)(pauVar302[3] + 4) =
                 fVar83 * fStack_264 + fVar71 * fVar356 + fVar67 * fVar346 + fVar341 +
                 fVar107 * fStack_2b4 + fVar95 * fVar61 + fVar73 * fVar365 +
                 fVar111 * fStack_284 + fVar103 * fStack_274 + fVar87 * fStack_294;
            *(float *)(pauVar302[3] + 8) =
                 fVar84 * fStack_260 + fVar80 * fVar358 + fVar68 * fVar334 + fVar342 +
                 fVar108 * fStack_2b0 + fVar96 * fVar62 + fVar74 * fVar366 +
                 fVar112 * fVar65 + fVar104 * fStack_270 + fVar88 * fStack_290;
            *(float *)(pauVar302[3] + 0xc) =
                 fVar85 * fStack_25c + fVar81 * fVar359 + fVar69 * fVar357 + fVar343 +
                 fVar109 * fStack_2ac + fVar97 * fVar63 + fVar75 * fVar367 +
                 fVar113 * fStack_27c + fVar105 * fStack_26c + fVar89 * fStack_28c;
            pauVar302 = pauVar302 + 4;
            iVar312 = iVar312 + 4;
            lVar294 = lVar294 + 0x80;
          }
          for (; iVar312 + 1 < iVar281; iVar312 = iVar312 + 2) {
            pfVar313 = (float *)((long)piVar306 + lVar294 + 0x20);
            fVar66 = *pfVar313;
            fVar67 = pfVar313[1];
            fVar68 = pfVar313[2];
            fVar69 = pfVar313[3];
            pfVar313 = (float *)((long)piVar310 + lVar294 + 0x20);
            fVar70 = *pfVar313;
            fVar71 = pfVar313[1];
            fVar72 = pfVar313[2];
            fVar73 = pfVar313[3];
            pfVar313 = (float *)((long)pvVar295 + lVar294 + 0x20);
            fVar74 = *pfVar313;
            fVar75 = pfVar313[1];
            fVar76 = pfVar313[2];
            fVar77 = pfVar313[3];
            pfVar313 = (float *)((long)piVar306 + lVar294);
            pfVar317 = (float *)((long)piVar306 + lVar294 + 0x10);
            pfVar308 = (float *)((long)piVar310 + lVar294);
            pfVar293 = (float *)((long)piVar310 + lVar294 + 0x10);
            pfVar315 = (float *)((long)pvVar295 + lVar294);
            pfVar291 = (float *)((long)pvVar295 + lVar294 + 0x10);
            auVar323._0_4_ =
                 fVar74 * fVar64 + *pfVar291 * local_2b8 + *pfVar315 * local_268 +
                 fVar70 * local_278 + *pfVar293 * fVar340 + *pfVar308 * fVar345 +
                 fVar66 * local_298 + *pfVar317 * fVar364 + *pfVar313 * fVar330 + fVar339;
            auVar323._4_4_ =
                 fVar75 * fStack_284 + pfVar291[1] * fStack_2b4 + pfVar315[1] * fStack_264 +
                 fVar71 * fStack_274 + pfVar293[1] * fVar61 + pfVar308[1] * fVar356 +
                 fVar67 * fStack_294 + pfVar317[1] * fVar365 + pfVar313[1] * fVar346 + fVar341;
            auVar323._8_4_ =
                 fVar76 * fVar65 + pfVar291[2] * fStack_2b0 + pfVar315[2] * fStack_260 +
                 fVar72 * fStack_270 + pfVar293[2] * fVar62 + pfVar308[2] * fVar358 +
                 fVar68 * fStack_290 + pfVar317[2] * fVar366 + pfVar313[2] * fVar334 + fVar342;
            auVar323._12_4_ =
                 fVar77 * fStack_27c + pfVar291[3] * fStack_2ac + pfVar315[3] * fStack_25c +
                 fVar73 * fStack_26c + pfVar293[3] * fVar63 + pfVar308[3] * fVar359 +
                 fVar69 * fStack_28c + pfVar317[3] * fVar367 + pfVar313[3] * fVar357 + fVar343;
            pfVar313 = (float *)((long)piVar306 + lVar294 + 0x30);
            fVar78 = *pfVar313;
            fVar79 = pfVar313[1];
            fVar80 = pfVar313[2];
            fVar81 = pfVar313[3];
            pfVar313 = (float *)((long)piVar306 + lVar294 + 0x40);
            fVar82 = *pfVar313;
            fVar83 = pfVar313[1];
            fVar84 = pfVar313[2];
            fVar85 = pfVar313[3];
            pfVar313 = (float *)((long)piVar310 + lVar294 + 0x30);
            fVar86 = *pfVar313;
            fVar87 = pfVar313[1];
            fVar88 = pfVar313[2];
            fVar89 = pfVar313[3];
            pfVar313 = (float *)((long)piVar310 + lVar294 + 0x40);
            fVar90 = *pfVar313;
            fVar91 = pfVar313[1];
            fVar360 = pfVar313[2];
            fVar361 = pfVar313[3];
            pfVar313 = (float *)((long)pvVar295 + lVar294 + 0x30);
            fVar362 = *pfVar313;
            fVar363 = pfVar313[1];
            fVar344 = pfVar313[2];
            fVar355 = pfVar313[3];
            pfVar313 = (float *)((long)pvVar295 + lVar294 + 0x40);
            fVar92 = *pfVar313;
            fVar93 = pfVar313[1];
            fVar94 = pfVar313[2];
            fVar95 = pfVar313[3];
            *pauVar302 = auVar323;
            *(float *)pauVar302[1] =
                 fVar74 * local_268 + fVar70 * fVar345 + fVar66 * fVar330 + fVar339 +
                 fVar362 * local_2b8 + fVar86 * fVar340 + fVar78 * fVar364 +
                 fVar92 * fVar64 + fVar90 * local_278 + fVar82 * local_298;
            *(float *)(pauVar302[1] + 4) =
                 fVar75 * fStack_264 + fVar71 * fVar356 + fVar67 * fVar346 + fVar341 +
                 fVar363 * fStack_2b4 + fVar87 * fVar61 + fVar79 * fVar365 +
                 fVar93 * fStack_284 + fVar91 * fStack_274 + fVar83 * fStack_294;
            *(float *)(pauVar302[1] + 8) =
                 fVar76 * fStack_260 + fVar72 * fVar358 + fVar68 * fVar334 + fVar342 +
                 fVar344 * fStack_2b0 + fVar88 * fVar62 + fVar80 * fVar366 +
                 fVar94 * fVar65 + fVar360 * fStack_270 + fVar84 * fStack_290;
            *(float *)(pauVar302[1] + 0xc) =
                 fVar77 * fStack_25c + fVar73 * fVar359 + fVar69 * fVar357 + fVar343 +
                 fVar355 * fStack_2ac + fVar89 * fVar63 + fVar81 * fVar367 +
                 fVar95 * fStack_27c + fVar361 * fStack_26c + fVar85 * fStack_28c;
            pauVar302 = pauVar302 + 2;
            lVar294 = lVar294 + 0x40;
          }
          for (; iVar312 < iVar281; iVar312 = iVar312 + 1) {
            pfVar313 = (float *)((long)piVar306 + lVar294);
            pfVar317 = (float *)((long)piVar306 + lVar294 + 0x10);
            pfVar293 = (float *)((long)piVar306 + lVar294 + 0x20);
            pfVar308 = (float *)((long)piVar310 + lVar294);
            pfVar291 = (float *)((long)piVar310 + lVar294 + 0x10);
            pfVar4 = (float *)((long)piVar310 + lVar294 + 0x20);
            pfVar315 = (float *)((long)pvVar295 + lVar294);
            pfVar5 = (float *)((long)pvVar295 + lVar294 + 0x10);
            pfVar27 = (float *)((long)pvVar295 + lVar294 + 0x20);
            auVar353._0_4_ =
                 *pfVar27 * fVar64 + *pfVar5 * local_2b8 + *pfVar315 * local_268 +
                 *pfVar4 * local_278 + *pfVar291 * fVar340 + *pfVar308 * fVar345 +
                 *pfVar293 * local_298 + *pfVar317 * fVar364 + *pfVar313 * fVar330 + fVar339;
            auVar353._4_4_ =
                 pfVar27[1] * fStack_284 + pfVar5[1] * fStack_2b4 + pfVar315[1] * fStack_264 +
                 pfVar4[1] * fStack_274 + pfVar291[1] * fVar61 + pfVar308[1] * fVar356 +
                 pfVar293[1] * fStack_294 + pfVar317[1] * fVar365 + pfVar313[1] * fVar346 + fVar341;
            auVar353._8_4_ =
                 pfVar27[2] * fVar65 + pfVar5[2] * fStack_2b0 + pfVar315[2] * fStack_260 +
                 pfVar4[2] * fStack_270 + pfVar291[2] * fVar62 + pfVar308[2] * fVar358 +
                 pfVar293[2] * fStack_290 + pfVar317[2] * fVar366 + pfVar313[2] * fVar334 + fVar342;
            auVar353._12_4_ =
                 pfVar27[3] * fStack_27c + pfVar5[3] * fStack_2ac + pfVar315[3] * fStack_25c +
                 pfVar4[3] * fStack_26c + pfVar291[3] * fVar63 + pfVar308[3] * fVar359 +
                 pfVar293[3] * fStack_28c + pfVar317[3] * fVar367 + pfVar313[3] * fVar357 + fVar343;
            *pauVar302 = auVar353;
            pauVar302 = pauVar302 + 1;
            lVar294 = lVar294 + 0x20;
          }
          piVar306 = (pointer)((long)piVar306 + lVar294 + lVar300);
          piVar310 = (pointer)((long)piVar310 + lVar294 + lVar300);
          pvVar295 = (void *)((long)pvVar295 + lVar294 + lVar300);
        }
      }
      goto LAB_003b1488;
    }
    bVar280 = bVar280 >> 2 & bVar280 >> 3 & (iVar290 == 5 && iVar289 == 5);
    if (((iVar281 == 1 && iVar287 == 1) & bVar280) == 1) {
      uVar297 = top_blob->w;
      iVar281 = top_blob->h;
      pvVar311 = (this->super_ConvolutionDepthWise).bias_data.data;
      uVar314 = 0;
      uVar316 = uVar297;
      if ((int)uVar297 < 1) {
        uVar316 = 0;
      }
      uVar301 = local_238.c;
      if (local_238.c < 1) {
        uVar301 = 0;
      }
      lVar300 = (long)(int)(uVar297 * 4) * 4;
      lVar294 = (long)(local_238.w * 4 + 0x10) * 4;
      for (; uVar314 != uVar301; uVar314 = uVar314 + 1) {
        if (pvVar311 == (void *)0x0) {
          fVar339 = 0.0;
          fVar341 = 0.0;
          fVar342 = 0.0;
          fVar343 = 0.0;
        }
        else {
          pfVar313 = (float *)((long)pvVar311 + uVar314 * 0x10);
          fVar339 = *pfVar313;
          fVar341 = pfVar313[1];
          fVar342 = pfVar313[2];
          fVar343 = pfVar313[3];
        }
        pvVar307 = (void *)(top_blob->cstep * uVar314 * top_blob->elemsize + (long)top_blob->data);
        pvVar52 = (this->weight_data_tm).data;
        lVar305 = (long)(this->weight_data_tm).w * uVar314 * (this->weight_data_tm).elemsize;
        pvVar303 = (void *)((long)top_blob->w * top_blob->elemsize + (long)pvVar307);
        piVar319 = (pointer)(local_238.cstep * uVar314 *
                             CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize) +
                            (long)local_238.data);
        lVar298 = (long)local_238.w *
                  CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize);
        piVar310 = (pointer)((long)piVar319 + lVar298);
        pvVar295 = (void *)((long)piVar319 + lVar298 * 2);
        pvVar296 = (void *)(lVar298 * 3 + (long)piVar319);
        piVar306 = piVar319 + lVar298;
        pvVar284 = (void *)(lVar298 * 5 + (long)piVar319);
        for (uVar297 = 0; (int)(uVar297 | 1) < iVar281; uVar297 = uVar297 + 2) {
          lVar298 = 0;
          uVar286 = uVar316;
          while (bVar320 = uVar286 != 0, uVar286 = uVar286 - 1, bVar320) {
            pfVar313 = (float *)((long)pvVar52 + lVar305);
            fVar330 = *pfVar313;
            fVar346 = pfVar313[1];
            fVar334 = pfVar313[2];
            fVar357 = pfVar313[3];
            pfVar313 = (float *)((long)pvVar52 + lVar305 + 0x10);
            fVar364 = *pfVar313;
            fVar365 = pfVar313[1];
            fVar366 = pfVar313[2];
            fVar367 = pfVar313[3];
            pfVar313 = (float *)((long)pvVar52 + lVar305 + 0x20);
            fVar345 = *pfVar313;
            fVar356 = pfVar313[1];
            fVar358 = pfVar313[2];
            fVar359 = pfVar313[3];
            pfVar313 = (float *)((long)pvVar52 + lVar305 + 0x30);
            fVar340 = *pfVar313;
            fVar61 = pfVar313[1];
            fVar62 = pfVar313[2];
            fVar63 = pfVar313[3];
            pfVar313 = (float *)((long)pvVar52 + lVar305 + 0x40);
            fVar64 = *pfVar313;
            fVar65 = pfVar313[1];
            fVar66 = pfVar313[2];
            fVar67 = pfVar313[3];
            pfVar313 = (float *)((long)piVar319 + lVar298);
            fVar68 = pfVar313[1];
            fVar69 = pfVar313[2];
            fVar70 = pfVar313[3];
            pfVar315 = (float *)((long)piVar319 + lVar298 + 0x10);
            fVar71 = pfVar315[1];
            fVar72 = pfVar315[2];
            fVar73 = pfVar315[3];
            pfVar317 = (float *)((long)piVar319 + lVar298 + 0x20);
            fVar74 = pfVar317[1];
            fVar75 = pfVar317[2];
            fVar76 = pfVar317[3];
            pfVar293 = (float *)((long)piVar319 + lVar298 + 0x30);
            fVar77 = pfVar293[1];
            fVar78 = pfVar293[2];
            fVar79 = pfVar293[3];
            pfVar291 = (float *)((long)piVar319 + lVar298 + 0x40);
            fVar80 = pfVar291[1];
            fVar81 = pfVar291[2];
            fVar82 = pfVar291[3];
            pfVar308 = (float *)((long)piVar310 + lVar298);
            fVar83 = *pfVar308;
            fVar84 = pfVar308[1];
            fVar85 = pfVar308[2];
            fVar86 = pfVar308[3];
            pfVar308 = (float *)((long)piVar310 + lVar298 + 0x10);
            fVar87 = *pfVar308;
            fVar88 = pfVar308[1];
            fVar89 = pfVar308[2];
            fVar90 = pfVar308[3];
            pfVar308 = (float *)((long)piVar310 + lVar298 + 0x20);
            fVar91 = *pfVar308;
            fVar360 = pfVar308[1];
            fVar361 = pfVar308[2];
            fVar362 = pfVar308[3];
            pfVar308 = (float *)((long)piVar310 + lVar298 + 0x30);
            fVar363 = *pfVar308;
            fVar344 = pfVar308[1];
            fVar355 = pfVar308[2];
            fVar92 = pfVar308[3];
            pfVar308 = (float *)((long)piVar310 + lVar298 + 0x40);
            fVar93 = *pfVar308;
            fVar94 = pfVar308[1];
            fVar95 = pfVar308[2];
            fVar96 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar52 + lVar305 + 0x50);
            fVar97 = *pfVar308;
            fVar98 = pfVar308[1];
            fVar99 = pfVar308[2];
            fVar100 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar52 + lVar305 + 0x60);
            fVar101 = *pfVar308;
            fVar102 = pfVar308[1];
            fVar103 = pfVar308[2];
            fVar104 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar52 + lVar305 + 0x70);
            fVar105 = *pfVar308;
            fVar106 = pfVar308[1];
            fVar107 = pfVar308[2];
            fVar108 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar52 + lVar305 + 0x80);
            fVar109 = *pfVar308;
            fVar110 = pfVar308[1];
            fVar111 = pfVar308[2];
            fVar112 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar52 + lVar305 + 0x90);
            fVar113 = *pfVar308;
            fVar114 = pfVar308[1];
            fVar115 = pfVar308[2];
            fVar116 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar295 + lVar298);
            fVar117 = *pfVar308;
            fVar118 = pfVar308[1];
            fVar119 = pfVar308[2];
            fVar120 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar295 + lVar298 + 0x10);
            fVar121 = *pfVar308;
            fVar122 = pfVar308[1];
            fVar123 = pfVar308[2];
            fVar124 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar295 + lVar298 + 0x20);
            fVar125 = *pfVar308;
            fVar126 = pfVar308[1];
            fVar127 = pfVar308[2];
            fVar128 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar295 + lVar298 + 0x30);
            fVar129 = *pfVar308;
            fVar130 = pfVar308[1];
            fVar131 = pfVar308[2];
            fVar132 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar295 + lVar298 + 0x40);
            fVar133 = *pfVar308;
            fVar134 = pfVar308[1];
            fVar135 = pfVar308[2];
            fVar136 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar52 + lVar305 + 0xa0);
            fVar137 = *pfVar308;
            fVar138 = pfVar308[1];
            fVar139 = pfVar308[2];
            fVar140 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar52 + lVar305 + 0xb0);
            fVar141 = *pfVar308;
            fVar142 = pfVar308[1];
            fVar143 = pfVar308[2];
            fVar144 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar52 + lVar305 + 0xc0);
            fVar145 = *pfVar308;
            fVar146 = pfVar308[1];
            fVar147 = pfVar308[2];
            fVar148 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar52 + lVar305 + 0xd0);
            fVar149 = *pfVar308;
            fVar150 = pfVar308[1];
            fVar151 = pfVar308[2];
            fVar152 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar52 + lVar305 + 0xe0);
            fVar153 = *pfVar308;
            fVar154 = pfVar308[1];
            fVar155 = pfVar308[2];
            fVar156 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar296 + lVar298);
            fVar157 = *pfVar308;
            fVar158 = pfVar308[1];
            fVar159 = pfVar308[2];
            fVar160 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar296 + lVar298 + 0x10);
            fVar161 = *pfVar308;
            fVar162 = pfVar308[1];
            fVar163 = pfVar308[2];
            fVar164 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar296 + lVar298 + 0x20);
            fVar165 = *pfVar308;
            fVar166 = pfVar308[1];
            fVar167 = pfVar308[2];
            fVar168 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar296 + lVar298 + 0x30);
            fVar169 = *pfVar308;
            fVar170 = pfVar308[1];
            fVar171 = pfVar308[2];
            fVar172 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar296 + lVar298 + 0x40);
            fVar173 = *pfVar308;
            fVar174 = pfVar308[1];
            fVar175 = pfVar308[2];
            fVar176 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar52 + lVar305 + 0xf0);
            fVar177 = *pfVar308;
            fVar178 = pfVar308[1];
            fVar179 = pfVar308[2];
            fVar180 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar52 + lVar305 + 0x100);
            fVar181 = *pfVar308;
            fVar182 = pfVar308[1];
            fVar183 = pfVar308[2];
            fVar184 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar52 + lVar305 + 0x110);
            fVar185 = *pfVar308;
            fVar186 = pfVar308[1];
            fVar187 = pfVar308[2];
            fVar188 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar52 + lVar305 + 0x120);
            fVar189 = *pfVar308;
            fVar190 = pfVar308[1];
            fVar191 = pfVar308[2];
            fVar192 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar52 + lVar305 + 0x130);
            fVar193 = *pfVar308;
            fVar194 = pfVar308[1];
            fVar195 = pfVar308[2];
            fVar196 = pfVar308[3];
            pfVar308 = (float *)((long)piVar306 + lVar298);
            fVar197 = *pfVar308;
            fVar198 = pfVar308[1];
            fVar199 = pfVar308[2];
            fVar200 = pfVar308[3];
            pfVar308 = (float *)((long)piVar306 + lVar298 + 0x10);
            fVar201 = *pfVar308;
            fVar202 = pfVar308[1];
            fVar203 = pfVar308[2];
            fVar204 = pfVar308[3];
            pfVar308 = (float *)((long)piVar306 + lVar298 + 0x20);
            fVar205 = *pfVar308;
            fVar206 = pfVar308[1];
            fVar207 = pfVar308[2];
            fVar208 = pfVar308[3];
            pfVar308 = (float *)((long)piVar306 + lVar298 + 0x30);
            fVar209 = *pfVar308;
            fVar210 = pfVar308[1];
            fVar211 = pfVar308[2];
            fVar212 = pfVar308[3];
            pfVar308 = (float *)((long)piVar306 + lVar298 + 0x40);
            fVar213 = *pfVar308;
            fVar214 = pfVar308[1];
            fVar215 = pfVar308[2];
            fVar216 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar52 + lVar305 + 0x140);
            fVar217 = *pfVar308;
            fVar218 = pfVar308[1];
            fVar219 = pfVar308[2];
            fVar220 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar52 + lVar305 + 0x150);
            fVar221 = *pfVar308;
            fVar222 = pfVar308[1];
            fVar223 = pfVar308[2];
            fVar224 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar52 + lVar305 + 0x160);
            fVar225 = *pfVar308;
            fVar226 = pfVar308[1];
            fVar227 = pfVar308[2];
            fVar228 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar52 + lVar305 + 0x170);
            fVar229 = *pfVar308;
            fVar230 = pfVar308[1];
            fVar231 = pfVar308[2];
            fVar232 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar52 + lVar305 + 0x180);
            fVar233 = *pfVar308;
            fVar234 = pfVar308[1];
            fVar235 = pfVar308[2];
            fVar236 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar284 + lVar298);
            fVar237 = *pfVar308;
            fVar238 = pfVar308[1];
            fVar239 = pfVar308[2];
            fVar240 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar284 + lVar298 + 0x10);
            fVar241 = *pfVar308;
            fVar242 = pfVar308[1];
            fVar243 = pfVar308[2];
            fVar244 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar284 + lVar298 + 0x20);
            fVar245 = *pfVar308;
            fVar246 = pfVar308[1];
            fVar247 = pfVar308[2];
            fVar248 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar284 + lVar298 + 0x30);
            fVar249 = *pfVar308;
            fVar250 = pfVar308[1];
            fVar251 = pfVar308[2];
            fVar252 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar284 + lVar298 + 0x40);
            fVar253 = *pfVar308;
            fVar254 = pfVar308[1];
            fVar255 = pfVar308[2];
            fVar256 = pfVar308[3];
            pfVar308 = (float *)((long)pvVar307 + lVar298);
            *pfVar308 = fVar213 * fVar233 +
                        fVar209 * fVar229 + fVar205 * fVar225 + fVar201 * fVar221 +
                        fVar197 * fVar217 +
                        fVar173 * fVar193 +
                        fVar169 * fVar189 +
                        fVar165 * fVar185 + fVar161 * fVar181 + fVar157 * fVar177 +
                        fVar133 * fVar153 +
                        fVar129 * fVar149 +
                        fVar125 * fVar145 + fVar121 * fVar141 + fVar117 * fVar137 +
                        fVar93 * fVar113 + fVar363 * fVar109 + fVar91 * fVar105 + fVar87 * fVar101 +
                        fVar83 * fVar97 + *pfVar291 * fVar64 + *pfVar293 * fVar340 +
                        *pfVar317 * fVar345 + *pfVar315 * fVar364 + *pfVar313 * fVar330 + fVar339;
            pfVar308[1] = fVar214 * fVar234 +
                          fVar210 * fVar230 + fVar206 * fVar226 + fVar202 * fVar222 +
                          fVar198 * fVar218 +
                          fVar174 * fVar194 +
                          fVar170 * fVar190 +
                          fVar166 * fVar186 + fVar162 * fVar182 + fVar158 * fVar178 +
                          fVar134 * fVar154 +
                          fVar130 * fVar150 +
                          fVar126 * fVar146 + fVar122 * fVar142 + fVar118 * fVar138 +
                          fVar94 * fVar114 +
                          fVar344 * fVar110 + fVar360 * fVar106 + fVar88 * fVar102 +
                          fVar84 * fVar98 + fVar80 * fVar65 + fVar77 * fVar61 +
                          fVar74 * fVar356 + fVar71 * fVar365 + fVar68 * fVar346 + fVar341;
            pfVar308[2] = fVar215 * fVar235 +
                          fVar211 * fVar231 + fVar207 * fVar227 + fVar203 * fVar223 +
                          fVar199 * fVar219 +
                          fVar175 * fVar195 +
                          fVar171 * fVar191 +
                          fVar167 * fVar187 + fVar163 * fVar183 + fVar159 * fVar179 +
                          fVar135 * fVar155 +
                          fVar131 * fVar151 +
                          fVar127 * fVar147 + fVar123 * fVar143 + fVar119 * fVar139 +
                          fVar95 * fVar115 +
                          fVar355 * fVar111 + fVar361 * fVar107 + fVar89 * fVar103 +
                          fVar85 * fVar99 + fVar81 * fVar66 + fVar78 * fVar62 +
                          fVar75 * fVar358 + fVar72 * fVar366 + fVar69 * fVar334 + fVar342;
            pfVar308[3] = fVar216 * fVar236 +
                          fVar212 * fVar232 + fVar208 * fVar228 + fVar204 * fVar224 +
                          fVar200 * fVar220 +
                          fVar176 * fVar196 +
                          fVar172 * fVar192 +
                          fVar168 * fVar188 + fVar164 * fVar184 + fVar160 * fVar180 +
                          fVar136 * fVar156 +
                          fVar132 * fVar152 +
                          fVar128 * fVar148 + fVar124 * fVar144 + fVar120 * fVar140 +
                          fVar96 * fVar116 + fVar92 * fVar112 + fVar362 * fVar108 + fVar90 * fVar104
                          + fVar86 * fVar100 + fVar82 * fVar67 + fVar79 * fVar63 +
                            fVar76 * fVar359 + fVar73 * fVar367 + fVar70 * fVar357 + fVar343;
            pfVar313 = (float *)((long)pvVar303 + lVar298);
            *pfVar313 = fVar233 * fVar253 +
                        fVar229 * fVar249 + fVar225 * fVar245 + fVar221 * fVar241 +
                        fVar217 * fVar237 +
                        fVar193 * fVar213 +
                        fVar189 * fVar209 +
                        fVar185 * fVar205 + fVar181 * fVar201 + fVar177 * fVar197 +
                        fVar153 * fVar173 +
                        fVar149 * fVar169 +
                        fVar145 * fVar165 + fVar141 * fVar161 + fVar137 * fVar157 +
                        fVar113 * fVar133 +
                        fVar109 * fVar129 + fVar105 * fVar125 + fVar101 * fVar121 +
                        fVar97 * fVar117 + fVar64 * fVar93 + fVar340 * fVar363 +
                        fVar345 * fVar91 + fVar364 * fVar87 + fVar330 * fVar83 + fVar339;
            pfVar313[1] = fVar234 * fVar254 +
                          fVar230 * fVar250 + fVar226 * fVar246 + fVar222 * fVar242 +
                          fVar218 * fVar238 +
                          fVar194 * fVar214 +
                          fVar190 * fVar210 +
                          fVar186 * fVar206 + fVar182 * fVar202 + fVar178 * fVar198 +
                          fVar154 * fVar174 +
                          fVar150 * fVar170 +
                          fVar146 * fVar166 + fVar142 * fVar162 + fVar138 * fVar158 +
                          fVar114 * fVar134 +
                          fVar110 * fVar130 + fVar106 * fVar126 + fVar102 * fVar122 +
                          fVar98 * fVar118 + fVar65 * fVar94 + fVar61 * fVar344 +
                          fVar356 * fVar360 + fVar365 * fVar88 + fVar346 * fVar84 + fVar341;
            pfVar313[2] = fVar235 * fVar255 +
                          fVar231 * fVar251 + fVar227 * fVar247 + fVar223 * fVar243 +
                          fVar219 * fVar239 +
                          fVar195 * fVar215 +
                          fVar191 * fVar211 +
                          fVar187 * fVar207 + fVar183 * fVar203 + fVar179 * fVar199 +
                          fVar155 * fVar175 +
                          fVar151 * fVar171 +
                          fVar147 * fVar167 + fVar143 * fVar163 + fVar139 * fVar159 +
                          fVar115 * fVar135 +
                          fVar111 * fVar131 + fVar107 * fVar127 + fVar103 * fVar123 +
                          fVar99 * fVar119 + fVar66 * fVar95 + fVar62 * fVar355 +
                          fVar358 * fVar361 + fVar366 * fVar89 + fVar334 * fVar85 + fVar342;
            pfVar313[3] = fVar236 * fVar256 +
                          fVar232 * fVar252 + fVar228 * fVar248 + fVar224 * fVar244 +
                          fVar220 * fVar240 +
                          fVar196 * fVar216 +
                          fVar192 * fVar212 +
                          fVar188 * fVar208 + fVar184 * fVar204 + fVar180 * fVar200 +
                          fVar156 * fVar176 +
                          fVar152 * fVar172 +
                          fVar148 * fVar168 + fVar144 * fVar164 + fVar140 * fVar160 +
                          fVar116 * fVar136 +
                          fVar112 * fVar132 + fVar108 * fVar128 + fVar104 * fVar124 +
                          fVar100 * fVar120 + fVar67 * fVar96 + fVar63 * fVar92 +
                          fVar359 * fVar362 + fVar367 * fVar90 + fVar357 * fVar86 + fVar343;
            lVar298 = lVar298 + 0x10;
          }
          piVar319 = (pointer)((long)piVar319 + lVar298 + lVar294);
          piVar310 = (pointer)((long)piVar310 + lVar298 + lVar294);
          pvVar295 = (void *)((long)pvVar295 + lVar298 + lVar294);
          pvVar296 = (void *)((long)pvVar296 + lVar298 + lVar294);
          piVar306 = (pointer)((long)piVar306 + lVar298 + lVar294);
          pvVar284 = (void *)((long)pvVar284 + lVar298 + lVar294);
          pvVar307 = (void *)((long)pvVar307 + lVar298 + lVar300);
          pvVar303 = (void *)((long)pvVar303 + lVar298 + lVar300);
        }
        for (; (int)uVar297 < iVar281; uVar297 = uVar297 + 1) {
          lVar298 = 0;
          uVar286 = uVar316;
          while (bVar320 = uVar286 != 0, uVar286 = uVar286 - 1, bVar320) {
            pfVar313 = (float *)((long)pvVar52 + lVar305);
            pfVar293 = (float *)((long)pvVar52 + lVar305 + 0x10);
            pfVar291 = (float *)((long)pvVar52 + lVar305 + 0x20);
            pfVar4 = (float *)((long)pvVar52 + lVar305 + 0x30);
            pfVar308 = (float *)((long)piVar319 + lVar298);
            pfVar5 = (float *)((long)pvVar52 + lVar305 + 0x40);
            pfVar27 = (float *)((long)piVar319 + lVar298 + 0x10);
            pfVar28 = (float *)((long)piVar319 + lVar298 + 0x20);
            pfVar6 = (float *)((long)piVar319 + lVar298 + 0x30);
            pfVar7 = (float *)((long)piVar319 + lVar298 + 0x40);
            pfVar8 = (float *)((long)pvVar52 + lVar305 + 0x50);
            pfVar9 = (float *)((long)pvVar52 + lVar305 + 0x60);
            pfVar10 = (float *)((long)pvVar52 + lVar305 + 0x70);
            pfVar31 = (float *)((long)pvVar52 + lVar305 + 0x80);
            pfVar32 = (float *)((long)pvVar52 + lVar305 + 0x90);
            pfVar315 = (float *)((long)piVar310 + lVar298);
            pfVar11 = (float *)((long)piVar310 + lVar298 + 0x10);
            pfVar12 = (float *)((long)piVar310 + lVar298 + 0x20);
            pfVar13 = (float *)((long)piVar310 + lVar298 + 0x30);
            pfVar14 = (float *)((long)piVar310 + lVar298 + 0x40);
            pfVar33 = (float *)((long)pvVar52 + lVar305 + 0xa0);
            pfVar34 = (float *)((long)pvVar52 + lVar305 + 0xb0);
            pfVar35 = (float *)((long)pvVar52 + lVar305 + 0xc0);
            pfVar36 = (float *)((long)pvVar52 + lVar305 + 0xd0);
            pfVar29 = (float *)((long)pvVar295 + lVar298);
            pfVar37 = (float *)((long)pvVar52 + lVar305 + 0xe0);
            pfVar15 = (float *)((long)pvVar295 + lVar298 + 0x10);
            pfVar16 = (float *)((long)pvVar295 + lVar298 + 0x20);
            pfVar17 = (float *)((long)pvVar295 + lVar298 + 0x30);
            pfVar18 = (float *)((long)pvVar295 + lVar298 + 0x40);
            pfVar38 = (float *)((long)pvVar52 + lVar305 + 0xf0);
            pfVar39 = (float *)((long)pvVar52 + lVar305 + 0x100);
            pfVar40 = (float *)((long)pvVar52 + lVar305 + 0x110);
            pfVar41 = (float *)((long)pvVar52 + lVar305 + 0x120);
            pfVar30 = (float *)((long)pvVar296 + lVar298);
            pfVar42 = (float *)((long)pvVar52 + lVar305 + 0x130);
            pfVar19 = (float *)((long)pvVar296 + lVar298 + 0x10);
            pfVar20 = (float *)((long)pvVar296 + lVar298 + 0x20);
            pfVar21 = (float *)((long)pvVar296 + lVar298 + 0x30);
            pfVar22 = (float *)((long)pvVar296 + lVar298 + 0x40);
            pfVar43 = (float *)((long)pvVar52 + lVar305 + 0x140);
            pfVar44 = (float *)((long)pvVar52 + lVar305 + 0x150);
            pfVar45 = (float *)((long)pvVar52 + lVar305 + 0x160);
            pfVar46 = (float *)((long)pvVar52 + lVar305 + 0x170);
            pfVar47 = (float *)((long)pvVar52 + lVar305 + 0x180);
            pfVar317 = (float *)((long)piVar306 + lVar298);
            pfVar23 = (float *)((long)piVar306 + lVar298 + 0x10);
            pfVar24 = (float *)((long)piVar306 + lVar298 + 0x20);
            pfVar25 = (float *)((long)piVar306 + lVar298 + 0x30);
            pfVar26 = (float *)((long)piVar306 + lVar298 + 0x40);
            auVar347._0_4_ =
                 *pfVar47 * *pfVar26 +
                 *pfVar46 * *pfVar25 + *pfVar45 * *pfVar24 + *pfVar44 * *pfVar23 +
                 *pfVar43 * *pfVar317 +
                 *pfVar42 * *pfVar22 +
                 *pfVar41 * *pfVar21 +
                 *pfVar40 * *pfVar20 + *pfVar39 * *pfVar19 + *pfVar38 * *pfVar30 +
                 *pfVar37 * *pfVar18 +
                 *pfVar36 * *pfVar17 +
                 *pfVar35 * *pfVar16 + *pfVar34 * *pfVar15 + *pfVar33 * *pfVar29 +
                 *pfVar32 * *pfVar14 +
                 *pfVar31 * *pfVar13 + *pfVar10 * *pfVar12 + *pfVar9 * *pfVar11 +
                 *pfVar8 * *pfVar315 + *pfVar5 * *pfVar7 + *pfVar4 * *pfVar6 +
                 *pfVar291 * *pfVar28 + *pfVar293 * *pfVar27 + *pfVar313 * *pfVar308 + fVar339;
            auVar347._4_4_ =
                 pfVar47[1] * pfVar26[1] +
                 pfVar46[1] * pfVar25[1] + pfVar45[1] * pfVar24[1] + pfVar44[1] * pfVar23[1] +
                 pfVar43[1] * pfVar317[1] +
                 pfVar42[1] * pfVar22[1] +
                 pfVar41[1] * pfVar21[1] +
                 pfVar40[1] * pfVar20[1] + pfVar39[1] * pfVar19[1] + pfVar38[1] * pfVar30[1] +
                 pfVar37[1] * pfVar18[1] +
                 pfVar36[1] * pfVar17[1] +
                 pfVar35[1] * pfVar16[1] + pfVar34[1] * pfVar15[1] + pfVar33[1] * pfVar29[1] +
                 pfVar32[1] * pfVar14[1] +
                 pfVar31[1] * pfVar13[1] + pfVar10[1] * pfVar12[1] + pfVar9[1] * pfVar11[1] +
                 pfVar8[1] * pfVar315[1] + pfVar5[1] * pfVar7[1] + pfVar4[1] * pfVar6[1] +
                 pfVar291[1] * pfVar28[1] + pfVar293[1] * pfVar27[1] +
                 pfVar313[1] * pfVar308[1] + fVar341;
            auVar347._8_4_ =
                 pfVar47[2] * pfVar26[2] +
                 pfVar46[2] * pfVar25[2] + pfVar45[2] * pfVar24[2] + pfVar44[2] * pfVar23[2] +
                 pfVar43[2] * pfVar317[2] +
                 pfVar42[2] * pfVar22[2] +
                 pfVar41[2] * pfVar21[2] +
                 pfVar40[2] * pfVar20[2] + pfVar39[2] * pfVar19[2] + pfVar38[2] * pfVar30[2] +
                 pfVar37[2] * pfVar18[2] +
                 pfVar36[2] * pfVar17[2] +
                 pfVar35[2] * pfVar16[2] + pfVar34[2] * pfVar15[2] + pfVar33[2] * pfVar29[2] +
                 pfVar32[2] * pfVar14[2] +
                 pfVar31[2] * pfVar13[2] + pfVar10[2] * pfVar12[2] + pfVar9[2] * pfVar11[2] +
                 pfVar8[2] * pfVar315[2] + pfVar5[2] * pfVar7[2] + pfVar4[2] * pfVar6[2] +
                 pfVar291[2] * pfVar28[2] + pfVar293[2] * pfVar27[2] +
                 pfVar313[2] * pfVar308[2] + fVar342;
            auVar347._12_4_ =
                 pfVar47[3] * pfVar26[3] +
                 pfVar46[3] * pfVar25[3] + pfVar45[3] * pfVar24[3] + pfVar44[3] * pfVar23[3] +
                 pfVar43[3] * pfVar317[3] +
                 pfVar42[3] * pfVar22[3] +
                 pfVar41[3] * pfVar21[3] +
                 pfVar40[3] * pfVar20[3] + pfVar39[3] * pfVar19[3] + pfVar38[3] * pfVar30[3] +
                 pfVar37[3] * pfVar18[3] +
                 pfVar36[3] * pfVar17[3] +
                 pfVar35[3] * pfVar16[3] + pfVar34[3] * pfVar15[3] + pfVar33[3] * pfVar29[3] +
                 pfVar32[3] * pfVar14[3] +
                 pfVar31[3] * pfVar13[3] + pfVar10[3] * pfVar12[3] + pfVar9[3] * pfVar11[3] +
                 pfVar8[3] * pfVar315[3] + pfVar5[3] * pfVar7[3] + pfVar4[3] * pfVar6[3] +
                 pfVar291[3] * pfVar28[3] + pfVar293[3] * pfVar27[3] +
                 pfVar313[3] * pfVar308[3] + fVar343;
            *(undefined1 (*) [16])((long)pvVar307 + lVar298) = auVar347;
            lVar298 = lVar298 + 0x10;
          }
          piVar319 = (pointer)((long)piVar319 + lVar298 + 0x40);
          piVar310 = (pointer)((long)piVar310 + lVar298 + 0x40);
          pvVar295 = (void *)((long)pvVar295 + lVar298 + 0x40);
          pvVar296 = (void *)((long)pvVar296 + lVar298 + 0x40);
          piVar306 = (pointer)((long)piVar306 + lVar298 + 0x40);
          pvVar307 = (void *)((long)pvVar307 + lVar298);
        }
      }
      goto LAB_003b1488;
    }
    if ((bVar280 & (iVar281 == 2 && iVar287 == 2)) == 1) {
      uVar297 = top_blob->w;
      pvVar311 = (this->super_ConvolutionDepthWise).bias_data.data;
      uVar299 = 0;
      uVar314 = (ulong)uVar297;
      if ((int)uVar297 < 1) {
        uVar314 = uVar299;
      }
      uVar288 = (ulong)(uint)top_blob->h;
      if (top_blob->h < 1) {
        uVar288 = uVar299;
      }
      uVar292 = (ulong)(uint)local_238.c;
      if (local_238.c < 1) {
        uVar292 = uVar299;
      }
      lVar300 = (long)(int)((local_238.w - uVar297) * 8) * 4;
      for (; uVar299 != uVar292; uVar299 = uVar299 + 1) {
        if (pvVar311 == (void *)0x0) {
          fVar339 = 0.0;
          fVar341 = 0.0;
          fVar342 = 0.0;
          fVar343 = 0.0;
        }
        else {
          pfVar313 = (float *)((long)pvVar311 + uVar299 * 0x10);
          fVar339 = *pfVar313;
          fVar341 = pfVar313[1];
          fVar342 = pfVar313[2];
          fVar343 = pfVar313[3];
        }
        pauVar302 = (undefined1 (*) [16])
                    (top_blob->cstep * uVar299 * top_blob->elemsize + (long)top_blob->data);
        pvVar52 = (this->weight_data_tm).data;
        lVar298 = (long)(this->weight_data_tm).w * uVar299 * (this->weight_data_tm).elemsize;
        piVar319 = (pointer)(local_238.cstep * uVar299 *
                             CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize) +
                            (long)local_238.data);
        lVar294 = (long)local_238.w *
                  CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize);
        piVar310 = (pointer)((long)piVar319 + lVar294);
        pvVar295 = (void *)((long)piVar319 + lVar294 * 2);
        pvVar284 = (void *)(lVar294 * 3 + (long)piVar319);
        piVar306 = piVar319 + lVar294;
        for (iVar281 = 0; iVar281 != (int)uVar288; iVar281 = iVar281 + 1) {
          lVar294 = 0;
          uVar285 = uVar314;
          while (iVar304 = (int)uVar285, uVar285 = (ulong)(iVar304 - 1), iVar304 != 0) {
            pfVar313 = (float *)((long)pvVar52 + lVar298);
            pfVar293 = (float *)((long)pvVar52 + lVar298 + 0x10);
            pfVar291 = (float *)((long)pvVar52 + lVar298 + 0x20);
            pfVar4 = (float *)((long)pvVar52 + lVar298 + 0x30);
            pfVar5 = (float *)((long)pvVar52 + lVar298 + 0x40);
            pfVar308 = (float *)((long)piVar319 + lVar294);
            pfVar27 = (float *)((long)piVar319 + lVar294 + 0x10);
            pfVar28 = (float *)((long)piVar319 + lVar294 + 0x20);
            pfVar6 = (float *)((long)piVar319 + lVar294 + 0x30);
            pfVar7 = (float *)((long)piVar319 + lVar294 + 0x40);
            pfVar8 = (float *)((long)pvVar52 + lVar298 + 0x50);
            pfVar9 = (float *)((long)pvVar52 + lVar298 + 0x60);
            pfVar10 = (float *)((long)pvVar52 + lVar298 + 0x70);
            pfVar31 = (float *)((long)pvVar52 + lVar298 + 0x80);
            pfVar32 = (float *)((long)pvVar52 + lVar298 + 0x90);
            pfVar315 = (float *)((long)piVar310 + lVar294);
            pfVar11 = (float *)((long)piVar310 + lVar294 + 0x10);
            pfVar12 = (float *)((long)piVar310 + lVar294 + 0x20);
            pfVar13 = (float *)((long)piVar310 + lVar294 + 0x30);
            pfVar14 = (float *)((long)piVar310 + lVar294 + 0x40);
            pfVar33 = (float *)((long)pvVar52 + lVar298 + 0xa0);
            pfVar34 = (float *)((long)pvVar52 + lVar298 + 0xb0);
            pfVar35 = (float *)((long)pvVar52 + lVar298 + 0xc0);
            pfVar36 = (float *)((long)pvVar52 + lVar298 + 0xd0);
            pfVar37 = (float *)((long)pvVar52 + lVar298 + 0xe0);
            pfVar317 = (float *)((long)pvVar295 + lVar294);
            pfVar15 = (float *)((long)pvVar295 + lVar294 + 0x10);
            pfVar16 = (float *)((long)pvVar295 + lVar294 + 0x20);
            pfVar17 = (float *)((long)pvVar295 + lVar294 + 0x30);
            pfVar18 = (float *)((long)pvVar295 + lVar294 + 0x40);
            pfVar38 = (float *)((long)pvVar52 + lVar298 + 0xf0);
            pfVar39 = (float *)((long)pvVar52 + lVar298 + 0x100);
            pfVar40 = (float *)((long)pvVar52 + lVar298 + 0x110);
            pfVar41 = (float *)((long)pvVar52 + lVar298 + 0x120);
            pfVar42 = (float *)((long)pvVar52 + lVar298 + 0x130);
            pfVar29 = (float *)((long)pvVar284 + lVar294);
            pfVar19 = (float *)((long)pvVar284 + lVar294 + 0x10);
            pfVar20 = (float *)((long)pvVar284 + lVar294 + 0x20);
            pfVar21 = (float *)((long)pvVar284 + lVar294 + 0x30);
            pfVar22 = (float *)((long)pvVar284 + lVar294 + 0x40);
            pfVar43 = (float *)((long)pvVar52 + lVar298 + 0x140);
            pfVar44 = (float *)((long)pvVar52 + lVar298 + 0x150);
            pfVar45 = (float *)((long)pvVar52 + lVar298 + 0x160);
            pfVar46 = (float *)((long)pvVar52 + lVar298 + 0x170);
            pfVar47 = (float *)((long)pvVar52 + lVar298 + 0x180);
            pfVar30 = (float *)((long)piVar306 + lVar294);
            pfVar23 = (float *)((long)piVar306 + lVar294 + 0x10);
            pfVar24 = (float *)((long)piVar306 + lVar294 + 0x20);
            pfVar25 = (float *)((long)piVar306 + lVar294 + 0x30);
            pfVar26 = (float *)((long)piVar306 + lVar294 + 0x40);
            auVar348._0_4_ =
                 *pfVar47 * *pfVar26 +
                 *pfVar46 * *pfVar25 + *pfVar45 * *pfVar24 + *pfVar44 * *pfVar23 +
                 *pfVar43 * *pfVar30 +
                 *pfVar42 * *pfVar22 +
                 *pfVar41 * *pfVar21 +
                 *pfVar40 * *pfVar20 + *pfVar39 * *pfVar19 + *pfVar38 * *pfVar29 +
                 *pfVar37 * *pfVar18 +
                 *pfVar36 * *pfVar17 +
                 *pfVar35 * *pfVar16 + *pfVar34 * *pfVar15 + *pfVar33 * *pfVar317 +
                 *pfVar32 * *pfVar14 +
                 *pfVar31 * *pfVar13 + *pfVar10 * *pfVar12 + *pfVar9 * *pfVar11 +
                 *pfVar8 * *pfVar315 + *pfVar5 * *pfVar7 + *pfVar4 * *pfVar6 +
                 *pfVar291 * *pfVar28 + *pfVar293 * *pfVar27 + *pfVar313 * *pfVar308 + fVar339;
            auVar348._4_4_ =
                 pfVar47[1] * pfVar26[1] +
                 pfVar46[1] * pfVar25[1] + pfVar45[1] * pfVar24[1] + pfVar44[1] * pfVar23[1] +
                 pfVar43[1] * pfVar30[1] +
                 pfVar42[1] * pfVar22[1] +
                 pfVar41[1] * pfVar21[1] +
                 pfVar40[1] * pfVar20[1] + pfVar39[1] * pfVar19[1] + pfVar38[1] * pfVar29[1] +
                 pfVar37[1] * pfVar18[1] +
                 pfVar36[1] * pfVar17[1] +
                 pfVar35[1] * pfVar16[1] + pfVar34[1] * pfVar15[1] + pfVar33[1] * pfVar317[1] +
                 pfVar32[1] * pfVar14[1] +
                 pfVar31[1] * pfVar13[1] + pfVar10[1] * pfVar12[1] + pfVar9[1] * pfVar11[1] +
                 pfVar8[1] * pfVar315[1] + pfVar5[1] * pfVar7[1] + pfVar4[1] * pfVar6[1] +
                 pfVar291[1] * pfVar28[1] + pfVar293[1] * pfVar27[1] +
                 pfVar313[1] * pfVar308[1] + fVar341;
            auVar348._8_4_ =
                 pfVar47[2] * pfVar26[2] +
                 pfVar46[2] * pfVar25[2] + pfVar45[2] * pfVar24[2] + pfVar44[2] * pfVar23[2] +
                 pfVar43[2] * pfVar30[2] +
                 pfVar42[2] * pfVar22[2] +
                 pfVar41[2] * pfVar21[2] +
                 pfVar40[2] * pfVar20[2] + pfVar39[2] * pfVar19[2] + pfVar38[2] * pfVar29[2] +
                 pfVar37[2] * pfVar18[2] +
                 pfVar36[2] * pfVar17[2] +
                 pfVar35[2] * pfVar16[2] + pfVar34[2] * pfVar15[2] + pfVar33[2] * pfVar317[2] +
                 pfVar32[2] * pfVar14[2] +
                 pfVar31[2] * pfVar13[2] + pfVar10[2] * pfVar12[2] + pfVar9[2] * pfVar11[2] +
                 pfVar8[2] * pfVar315[2] + pfVar5[2] * pfVar7[2] + pfVar4[2] * pfVar6[2] +
                 pfVar291[2] * pfVar28[2] + pfVar293[2] * pfVar27[2] +
                 pfVar313[2] * pfVar308[2] + fVar342;
            auVar348._12_4_ =
                 pfVar47[3] * pfVar26[3] +
                 pfVar46[3] * pfVar25[3] + pfVar45[3] * pfVar24[3] + pfVar44[3] * pfVar23[3] +
                 pfVar43[3] * pfVar30[3] +
                 pfVar42[3] * pfVar22[3] +
                 pfVar41[3] * pfVar21[3] +
                 pfVar40[3] * pfVar20[3] + pfVar39[3] * pfVar19[3] + pfVar38[3] * pfVar29[3] +
                 pfVar37[3] * pfVar18[3] +
                 pfVar36[3] * pfVar17[3] +
                 pfVar35[3] * pfVar16[3] + pfVar34[3] * pfVar15[3] + pfVar33[3] * pfVar317[3] +
                 pfVar32[3] * pfVar14[3] +
                 pfVar31[3] * pfVar13[3] + pfVar10[3] * pfVar12[3] + pfVar9[3] * pfVar11[3] +
                 pfVar8[3] * pfVar315[3] + pfVar5[3] * pfVar7[3] + pfVar4[3] * pfVar6[3] +
                 pfVar291[3] * pfVar28[3] + pfVar293[3] * pfVar27[3] +
                 pfVar313[3] * pfVar308[3] + fVar343;
            *pauVar302 = auVar348;
            pauVar302 = pauVar302 + 1;
            lVar294 = lVar294 + 0x20;
          }
          piVar319 = (pointer)((long)piVar319 + lVar294 + lVar300);
          piVar310 = (pointer)((long)piVar310 + lVar294 + lVar300);
          pvVar295 = (void *)((long)pvVar295 + lVar294 + lVar300);
          pvVar284 = (void *)((long)pvVar284 + lVar294 + lVar300);
          piVar306 = (pointer)((long)piVar306 + lVar294 + lVar300);
        }
      }
      goto LAB_003b1488;
    }
    uVar316 = iVar290 * iVar289;
    std::vector<int,_std::allocator<int>_>::vector
              (&_space_ofs,(long)(int)uVar316,(allocator_type *)&opt_p);
    iVar281 = (this->super_ConvolutionDepthWise).dilation_h;
    iVar287 = (this->super_ConvolutionDepthWise).kernel_w;
    iVar289 = (this->super_ConvolutionDepthWise).dilation_w * iVar287;
    iVar290 = 0;
    lVar300 = 0;
    for (iVar283 = 0; auVar325 = _DAT_00551680, auVar322 = _DAT_00551640,
        iVar283 < (this->super_ConvolutionDepthWise).kernel_h; iVar283 = iVar283 + 1) {
      for (lVar294 = 0; (int)lVar294 < iVar287; lVar294 = lVar294 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar300 + lVar294] = iVar290;
        iVar290 = iVar290 + (this->super_ConvolutionDepthWise).dilation_w;
        iVar287 = (this->super_ConvolutionDepthWise).kernel_w;
      }
      iVar290 = iVar290 + (iVar276 * iVar281 - iVar289);
      lVar300 = (int)lVar300 + lVar294;
    }
    iVar281 = 0;
    uVar301 = uVar316;
    if ((int)uVar316 < 1) {
      uVar301 = 0;
    }
    if ((int)uVar297 < 1) {
      uVar299 = 0;
    }
    auVar323 = (undefined1  [16])0x0;
    uVar335 = 0xc2b0c0a5;
    uVar336 = 0xc2b0c0a5;
    uVar337 = 0xc2b0c0a5;
    uVar338 = 0xc2b0c0a5;
    fVar339 = (float)DAT_00551680;
    fVar341 = DAT_00551680._4_4_;
    fVar342 = DAT_00551680._8_4_;
    fVar343 = DAT_00551680._12_4_;
    for (uVar314 = 0; uVar314 != uVar299; uVar314 = uVar314 + 1) {
      pvVar311 = (void *)(top_blob->cstep * uVar314 * top_blob->elemsize + (long)top_blob->data);
      pvVar295 = (this->weight_data_tm).data;
      for (iVar287 = 0; iVar287 <= iVar312; iVar287 = iVar287 + 1) {
        for (lVar300 = 0; lVar300 <= iVar304; lVar300 = lVar300 + 1) {
          if ((this->super_ConvolutionDepthWise).bias_term == 0) {
            auVar328 = ZEXT816(0);
          }
          else {
            auVar328 = *(undefined1 (*) [16])
                        ((long)(this->super_ConvolutionDepthWise).bias_data.data + uVar314 * 0x10);
          }
          lVar294 = 0;
          while( true ) {
            fVar330 = auVar328._0_4_;
            fVar346 = auVar328._4_4_;
            fVar334 = auVar328._8_4_;
            fVar357 = auVar328._12_4_;
            if ((ulong)uVar301 * 4 == lVar294) break;
            auVar353 = *(undefined1 (*) [16])
                        ((long)local_238.data +
                        (long)*(int *)((long)_space_ofs.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start + lVar294) * 0x10 +
                        (long)((this->super_ConvolutionDepthWise).stride_w * (int)lVar300 * 4) * 4 +
                        (long)iVar287 * (long)(this->super_ConvolutionDepthWise).stride_h *
                        (long)local_238.w *
                        CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize) +
                        local_238.cstep * uVar314 *
                        CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize));
            pfVar313 = (float *)((long)pvVar295 + lVar294 * 4 + (long)iVar281 * 4);
            auVar328._0_4_ = fVar330 + *pfVar313 * auVar353._0_4_;
            auVar328._4_4_ = fVar346 + pfVar313[1] * auVar353._4_4_;
            auVar328._8_4_ = fVar334 + pfVar313[2] * auVar353._8_4_;
            auVar328._12_4_ = fVar357 + pfVar313[3] * auVar353._12_4_;
            lVar294 = lVar294 + 4;
          }
          iVar289 = (this->super_ConvolutionDepthWise).activation_type;
          auVar349 = auVar328;
          if (5 < iVar289 - 1U) goto switchD_003b16ca_caseD_1;
          auVar349 = maxps(auVar328,auVar323);
          switch(iVar289) {
          case 2:
            auVar353 = minps(auVar328,auVar323);
            fVar330 = *(this->super_ConvolutionDepthWise).activation_params.data;
            auVar350._0_4_ = auVar349._0_4_ + fVar330 * auVar353._0_4_;
            auVar350._4_4_ = auVar349._4_4_ + fVar330 * auVar353._4_4_;
            auVar350._8_4_ = auVar349._8_4_ + fVar330 * auVar353._8_4_;
            auVar350._12_4_ = auVar349._12_4_ + fVar330 * auVar353._12_4_;
            auVar349 = auVar350;
            break;
          case 3:
            puVar55 = (undefined4 *)(this->super_ConvolutionDepthWise).activation_params.data;
            uVar48 = *puVar55;
            uVar49 = puVar55[1];
            auVar333._4_4_ = uVar48;
            auVar333._0_4_ = uVar48;
            auVar333._8_4_ = uVar48;
            auVar333._12_4_ = uVar48;
            auVar351._4_4_ = uVar49;
            auVar351._0_4_ = uVar49;
            auVar351._8_4_ = uVar49;
            auVar351._12_4_ = uVar49;
            auVar353 = maxps(auVar328,auVar333);
            auVar349 = minps(auVar353,auVar351);
            break;
          case 4:
            auVar329._0_8_ = auVar328._0_8_ ^ 0x8000000080000000;
            auVar329._8_4_ = -fVar334;
            auVar329._12_4_ = -fVar357;
            auVar353 = minps(auVar329,auVar322);
            auVar59._4_4_ = uVar336;
            auVar59._0_4_ = uVar335;
            auVar59._8_4_ = uVar337;
            auVar59._12_4_ = uVar338;
            auVar353 = maxps(auVar353,auVar59);
            fVar346 = auVar353._0_4_ * 1.442695 + 0.5;
            fVar357 = auVar353._4_4_ * 1.442695 + 0.5;
            fVar365 = auVar353._8_4_ * 1.442695 + 0.5;
            fVar367 = auVar353._12_4_ * 1.442695 + 0.5;
            fVar330 = (float)(int)fVar346;
            fVar334 = (float)(int)fVar357;
            fVar364 = (float)(int)fVar365;
            fVar366 = (float)(int)fVar367;
            fVar330 = fVar330 - (float)(-(uint)(fVar346 < fVar330) & (uint)fVar339);
            fVar334 = fVar334 - (float)(-(uint)(fVar357 < fVar334) & (uint)fVar341);
            fVar364 = fVar364 - (float)(-(uint)(fVar365 < fVar364) & (uint)fVar342);
            fVar366 = fVar366 - (float)(-(uint)(fVar367 < fVar366) & (uint)fVar343);
            fVar346 = fVar330 * -0.6931472 + auVar353._0_4_;
            fVar357 = fVar334 * -0.6931472 + auVar353._4_4_;
            fVar365 = fVar364 * -0.6931472 + auVar353._8_4_;
            fVar367 = fVar366 * -0.6931472 + auVar353._12_4_;
            auVar60._4_4_ =
                 (float)((int)fVar334 * 0x800000 + (int)fVar341) *
                 (fVar357 + fVar341 +
                 (((((fVar357 * 0.00019875691 + 0.0013981999) * fVar357 + 0.008333452) * fVar357 +
                   0.041665796) * fVar357 + 0.16666666) * fVar357 + 0.5) * fVar357 * fVar357) +
                 fVar341;
            auVar60._0_4_ =
                 (float)((int)fVar330 * 0x800000 + (int)fVar339) *
                 (fVar346 + fVar339 +
                 (((((fVar346 * 0.00019875691 + 0.0013981999) * fVar346 + 0.008333452) * fVar346 +
                   0.041665796) * fVar346 + 0.16666666) * fVar346 + 0.5) * fVar346 * fVar346) +
                 fVar339;
            auVar60._8_4_ =
                 (float)((int)fVar364 * 0x800000 + (int)fVar342) *
                 (fVar365 + fVar342 +
                 (((((fVar365 * 0.00019875691 + 0.0013981999) * fVar365 + 0.008333452) * fVar365 +
                   0.041665796) * fVar365 + 0.16666666) * fVar365 + 0.5) * fVar365 * fVar365) +
                 fVar342;
            auVar60._12_4_ =
                 (float)((int)fVar366 * 0x800000 + (int)fVar343) *
                 (fVar367 + fVar343 +
                 (((((fVar367 * 0.00019875691 + 0.0013981999) * fVar367 + 0.008333452) * fVar367 +
                   0.041665796) * fVar367 + 0.16666666) * fVar367 + 0.5) * fVar367 * fVar367) +
                 fVar343;
            auVar349 = divps(auVar325,auVar60);
            break;
          case 5:
            auVar323 = minps(auVar328,auVar322);
            auVar58._4_4_ = uVar336;
            auVar58._0_4_ = uVar335;
            auVar58._8_4_ = uVar337;
            auVar58._12_4_ = uVar338;
            auVar323 = maxps(auVar323,auVar58);
            fVar364 = auVar323._0_4_ * 1.442695 + 0.5;
            fVar365 = auVar323._4_4_ * 1.442695 + 0.5;
            fVar366 = auVar323._8_4_ * 1.442695 + 0.5;
            fVar367 = auVar323._12_4_ * 1.442695 + 0.5;
            fVar345 = (float)(int)fVar364;
            fVar356 = (float)(int)fVar365;
            fVar358 = (float)(int)fVar366;
            fVar359 = (float)(int)fVar367;
            fVar345 = fVar345 - (float)(-(uint)(fVar364 < fVar345) & (uint)fVar339);
            fVar356 = fVar356 - (float)(-(uint)(fVar365 < fVar356) & (uint)fVar341);
            fVar358 = fVar358 - (float)(-(uint)(fVar366 < fVar358) & (uint)fVar342);
            fVar359 = fVar359 - (float)(-(uint)(fVar367 < fVar359) & (uint)fVar343);
            fVar364 = auVar323._0_4_ - fVar345 * 0.6931472;
            fVar365 = auVar323._4_4_ - fVar356 * 0.6931472;
            fVar366 = auVar323._8_4_ - fVar358 * 0.6931472;
            fVar367 = auVar323._12_4_ - fVar359 * 0.6931472;
            auVar368._0_4_ =
                 (float)((int)fVar345 * 0x800000 + (int)fVar339) *
                 (fVar364 + fVar339 +
                 (((((fVar364 * 0.00019875691 + 0.0013981999) * fVar364 + 0.008333452) * fVar364 +
                   0.041665796) * fVar364 + 0.16666666) * fVar364 + 0.5) * fVar364 * fVar364) +
                 fVar339;
            auVar368._4_4_ =
                 (float)((int)fVar356 * 0x800000 + (int)fVar341) *
                 (fVar365 + fVar341 +
                 (((((fVar365 * 0.00019875691 + 0.0013981999) * fVar365 + 0.008333452) * fVar365 +
                   0.041665796) * fVar365 + 0.16666666) * fVar365 + 0.5) * fVar365 * fVar365) +
                 fVar341;
            auVar368._8_4_ =
                 (float)((int)fVar358 * 0x800000 + (int)fVar342) *
                 (fVar366 + fVar342 +
                 (((((fVar366 * 0.00019875691 + 0.0013981999) * fVar366 + 0.008333452) * fVar366 +
                   0.041665796) * fVar366 + 0.16666666) * fVar366 + 0.5) * fVar366 * fVar366) +
                 fVar342;
            auVar368._12_4_ =
                 (float)((int)fVar359 * 0x800000 + (int)fVar343) *
                 (fVar367 + fVar343 +
                 (((((fVar367 * 0.00019875691 + 0.0013981999) * fVar367 + 0.008333452) * fVar367 +
                   0.041665796) * fVar367 + 0.16666666) * fVar367 + 0.5) * fVar367 * fVar367) +
                 fVar343;
            auVar323 = maxps(auVar368,_DAT_005516f0);
            fVar364 = (float)(auVar323._0_4_ & 0x807fffff | 0x3f000000);
            fVar366 = (float)(auVar323._4_4_ & 0x807fffff | 0x3f000000);
            fVar345 = (float)(auVar323._8_4_ & 0x807fffff | 0x3f000000);
            fVar358 = (float)(auVar323._12_4_ & 0x807fffff | 0x3f000000);
            fVar365 = fVar364 + -1.0 + (float)(-(uint)(fVar364 < 0.70710677) & (uint)fVar364);
            fVar367 = fVar366 + -1.0 + (float)(-(uint)(fVar366 < 0.70710677) & (uint)fVar366);
            fVar356 = fVar345 + -1.0 + (float)(-(uint)(fVar345 < 0.70710677) & (uint)fVar345);
            fVar359 = fVar358 + -1.0 + (float)(-(uint)(fVar358 < 0.70710677) & (uint)fVar358);
            uVar335 = (undefined4)DAT_00551650;
            uVar336 = DAT_00551650._4_4_;
            uVar337 = DAT_00551650._8_4_;
            uVar338 = DAT_00551650._12_4_;
            auVar332._0_8_ =
                 CONCAT44(-(uint)(auVar368._4_4_ <= 0.0),-(uint)(auVar368._0_4_ <= 0.0)) &
                 0x7fffffff7fffffff;
            auVar332._8_4_ = -(uint)(auVar368._8_4_ <= 0.0) & 0x7fffffff;
            auVar332._12_4_ = -(uint)(auVar368._12_4_ <= 0.0) & 0x7fffffff;
            auVar56._4_4_ =
                 ~-(uint)(auVar368._4_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar323._4_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar366 < 0.70710677) & (uint)fVar341)) * 0.6931472 +
                         fVar367 +
                        (((((((((fVar367 * 0.070376836 + -0.1151461) * fVar367 + 0.116769984) *
                               fVar367 + -0.12420141) * fVar367 + 0.14249323) * fVar367 +
                            -0.16668057) * fVar367 + 0.20000714) * fVar367 + -0.24999994) * fVar367
                         + 0.3333333) * fVar367 + -0.5) * fVar367 * fVar367) * -2.0);
            auVar56._0_4_ =
                 ~-(uint)(auVar368._0_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar323._0_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar364 < 0.70710677) & (uint)fVar339)) * 0.6931472 +
                         fVar365 +
                        (((((((((fVar365 * 0.070376836 + -0.1151461) * fVar365 + 0.116769984) *
                               fVar365 + -0.12420141) * fVar365 + 0.14249323) * fVar365 +
                            -0.16668057) * fVar365 + 0.20000714) * fVar365 + -0.24999994) * fVar365
                         + 0.3333333) * fVar365 + -0.5) * fVar365 * fVar365) * -2.0);
            auVar56._8_4_ =
                 ~-(uint)(auVar368._8_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar323._8_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar345 < 0.70710677) & (uint)fVar342)) * 0.6931472 +
                         fVar356 +
                        (((((((((fVar356 * 0.070376836 + -0.1151461) * fVar356 + 0.116769984) *
                               fVar356 + -0.12420141) * fVar356 + 0.14249323) * fVar356 +
                            -0.16668057) * fVar356 + 0.20000714) * fVar356 + -0.24999994) * fVar356
                         + 0.3333333) * fVar356 + -0.5) * fVar356 * fVar356) * -2.0);
            auVar56._12_4_ =
                 ~-(uint)(auVar368._12_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar323._12_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar358 < 0.70710677) & (uint)fVar343)) * 0.6931472 +
                         fVar359 +
                        (((((((((fVar359 * 0.070376836 + -0.1151461) * fVar359 + 0.116769984) *
                               fVar359 + -0.12420141) * fVar359 + 0.14249323) * fVar359 +
                            -0.16668057) * fVar359 + 0.20000714) * fVar359 + -0.24999994) * fVar359
                         + 0.3333333) * fVar359 + -0.5) * fVar359 * fVar359) * -2.0);
            auVar323 = minps(auVar332 | auVar56,auVar322);
            auVar323 = maxps(auVar323,_DAT_00551650);
            fVar364 = auVar323._0_4_ * 1.442695 + 0.5;
            fVar365 = auVar323._4_4_ * 1.442695 + 0.5;
            fVar366 = auVar323._8_4_ * 1.442695 + 0.5;
            fVar367 = auVar323._12_4_ * 1.442695 + 0.5;
            fVar345 = (float)(int)fVar364;
            fVar356 = (float)(int)fVar365;
            fVar358 = (float)(int)fVar366;
            fVar359 = (float)(int)fVar367;
            fVar345 = fVar345 - (float)(-(uint)(fVar364 < fVar345) & (uint)fVar339);
            fVar356 = fVar356 - (float)(-(uint)(fVar365 < fVar356) & (uint)fVar341);
            fVar358 = fVar358 - (float)(-(uint)(fVar366 < fVar358) & (uint)fVar342);
            fVar359 = fVar359 - (float)(-(uint)(fVar367 < fVar359) & (uint)fVar343);
            fVar364 = auVar323._0_4_ - fVar345 * 0.6931472;
            fVar365 = auVar323._4_4_ - fVar356 * 0.6931472;
            fVar366 = auVar323._8_4_ - fVar358 * 0.6931472;
            fVar367 = auVar323._12_4_ - fVar359 * 0.6931472;
            auVar323 = ZEXT816(0);
            auVar57._4_4_ =
                 (float)((int)fVar356 * 0x800000 + (int)fVar341) *
                 (fVar365 + fVar341 +
                 (((((fVar365 * 0.00019875691 + 0.0013981999) * fVar365 + 0.008333452) * fVar365 +
                   0.041665796) * fVar365 + 0.16666666) * fVar365 + 0.5) * fVar365 * fVar365) +
                 fVar341;
            auVar57._0_4_ =
                 (float)((int)fVar345 * 0x800000 + (int)fVar339) *
                 (fVar364 + fVar339 +
                 (((((fVar364 * 0.00019875691 + 0.0013981999) * fVar364 + 0.008333452) * fVar364 +
                   0.041665796) * fVar364 + 0.16666666) * fVar364 + 0.5) * fVar364 * fVar364) +
                 fVar339;
            auVar57._8_4_ =
                 (float)((int)fVar358 * 0x800000 + (int)fVar342) *
                 (fVar366 + fVar342 +
                 (((((fVar366 * 0.00019875691 + 0.0013981999) * fVar366 + 0.008333452) * fVar366 +
                   0.041665796) * fVar366 + 0.16666666) * fVar366 + 0.5) * fVar366 * fVar366) +
                 fVar342;
            auVar57._12_4_ =
                 (float)((int)fVar359 * 0x800000 + (int)fVar343) *
                 (fVar367 + fVar343 +
                 (((((fVar367 * 0.00019875691 + 0.0013981999) * fVar367 + 0.008333452) * fVar367 +
                   0.041665796) * fVar367 + 0.16666666) * fVar367 + 0.5) * fVar367 * fVar367) +
                 fVar343;
            auVar353 = divps(_DAT_005520e0,auVar57);
            auVar354._0_4_ = auVar353._0_4_ + -1.0;
            auVar354._4_4_ = auVar353._4_4_ + -1.0;
            auVar354._8_4_ = auVar353._8_4_ + -1.0;
            auVar354._12_4_ = auVar353._12_4_ + -1.0;
            goto LAB_003b1a0a;
          case 6:
            pfVar313 = (float *)(this->super_ConvolutionDepthWise).activation_params.data;
            fVar364 = *pfVar313;
            fVar365 = pfVar313[1];
            auVar352._0_4_ = fVar364 * fVar330 + fVar365;
            auVar352._4_4_ = fVar364 * fVar346 + fVar365;
            auVar352._8_4_ = fVar364 * fVar334 + fVar365;
            auVar352._12_4_ = fVar364 * fVar357 + fVar365;
            auVar353 = maxps(auVar352,auVar323);
            auVar354 = minps(auVar353,auVar325);
LAB_003b1a0a:
            auVar349._0_4_ = auVar354._0_4_ * fVar330;
            auVar349._4_4_ = auVar354._4_4_ * fVar346;
            auVar349._8_4_ = auVar354._8_4_ * fVar334;
            auVar349._12_4_ = auVar354._12_4_ * fVar357;
          }
switchD_003b16ca_caseD_1:
          *(undefined1 (*) [16])((long)pvVar311 + lVar300 * 0x10) = auVar349;
        }
        pvVar311 = (void *)((long)pvVar311 + (long)(_w * 4) * 4);
      }
      iVar281 = iVar281 + uVar316 * 4;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
  }
  iVar290 = 0;
LAB_003b1b2b:
  piVar53 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
  if (piVar53 != (int *)0x0) {
    LOCK();
    *piVar53 = *piVar53 + -1;
    UNLOCK();
    if (*piVar53 == 0) {
      if (local_238.allocator == (Allocator *)0x0) {
        free(local_238.data);
      }
      else {
        (*(local_238.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar290;
}

Assistant:

int ConvolutionDepthWise_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps(((const float*)bias_data) + g * 16);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                _sum = _mm512_fmadd_ps(_val, _w, _sum);
                            }

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps(((const float*)bias_data) + g * 8);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                            }

                            _mm256_storeu_ps(outptr + j * 8, _sum);
                        }

                        outptr += outw * 8;
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps(((const float*)bias_data) + g * 4);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr + j * 4, _sum);
                        }

                        outptr += outw * 4;
                    }
                }

                return 0;
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
        g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
        g_elempack = channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
        if (bottom_blob_bordered_unpacked.empty())
            return -100;
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        int ret = op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        if (ret != 0)
            return ret;
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        if (top_blob.empty())
            return -100;
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}